

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [12];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  byte bVar56;
  ulong uVar57;
  byte bVar58;
  uint uVar59;
  ulong uVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  long lVar65;
  long lVar66;
  undefined1 uVar67;
  bool bVar68;
  undefined1 uVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar137;
  uint uVar138;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar140;
  uint uVar141;
  uint uVar142;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  uint uVar139;
  uint uVar143;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar144;
  float fVar169;
  vint4 bi_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar167 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar168 [64];
  vint4 bi_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  vint4 bi;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  vint4 ai_2;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [64];
  vint4 ai_1;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined4 uVar240;
  float fVar241;
  float fVar250;
  float fVar251;
  vint4 ai;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar249 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar260;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar264 [28];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [16];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_a5d;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  undefined1 local_8e0 [16];
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  Primitive *local_630;
  ulong local_628;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  RTCHitN local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  uint local_2a0;
  uint uStack_29c;
  uint uStack_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 uStack_140;
  float afStack_138 [66];
  undefined1 extraout_var_01 [60];
  undefined1 auVar273 [16];
  
  PVar2 = prim[1];
  uVar70 = (ulong)(byte)PVar2;
  lVar66 = uVar70 * 0x25;
  fVar144 = *(float *)(prim + lVar66 + 0x12);
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar76 = vsubps_avx(auVar76,*(undefined1 (*) [16])(prim + lVar66 + 6));
  auVar215._0_4_ = fVar144 * auVar76._0_4_;
  auVar215._4_4_ = fVar144 * auVar76._4_4_;
  auVar215._8_4_ = fVar144 * auVar76._8_4_;
  auVar215._12_4_ = fVar144 * auVar76._12_4_;
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar145._0_4_ = fVar144 * auVar75._0_4_;
  auVar145._4_4_ = fVar144 * auVar75._4_4_;
  auVar145._8_4_ = fVar144 * auVar75._8_4_;
  auVar145._12_4_ = fVar144 * auVar75._12_4_;
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar276 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar276 = vcvtdq2ps_avx(auVar276);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar70 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar233._4_4_ = auVar145._0_4_;
  auVar233._0_4_ = auVar145._0_4_;
  auVar233._8_4_ = auVar145._0_4_;
  auVar233._12_4_ = auVar145._0_4_;
  auVar83 = vshufps_avx(auVar145,auVar145,0x55);
  auVar82 = vshufps_avx(auVar145,auVar145,0xaa);
  fVar144 = auVar82._0_4_;
  auVar191._0_4_ = fVar144 * auVar78._0_4_;
  fVar169 = auVar82._4_4_;
  auVar191._4_4_ = fVar169 * auVar78._4_4_;
  fVar241 = auVar82._8_4_;
  auVar191._8_4_ = fVar241 * auVar78._8_4_;
  fVar250 = auVar82._12_4_;
  auVar191._12_4_ = fVar250 * auVar78._12_4_;
  auVar170._0_4_ = auVar80._0_4_ * fVar144;
  auVar170._4_4_ = auVar80._4_4_ * fVar169;
  auVar170._8_4_ = auVar80._8_4_ * fVar241;
  auVar170._12_4_ = auVar80._12_4_ * fVar250;
  auVar146._0_4_ = auVar86._0_4_ * fVar144;
  auVar146._4_4_ = auVar86._4_4_ * fVar169;
  auVar146._8_4_ = auVar86._8_4_ * fVar241;
  auVar146._12_4_ = auVar86._12_4_ * fVar250;
  auVar82 = vfmadd231ps_fma(auVar191,auVar83,auVar75);
  auVar84 = vfmadd231ps_fma(auVar170,auVar83,auVar79);
  auVar83 = vfmadd231ps_fma(auVar146,auVar77,auVar83);
  auVar87 = vfmadd231ps_fma(auVar82,auVar233,auVar76);
  auVar84 = vfmadd231ps_fma(auVar84,auVar233,auVar276);
  auVar85 = vfmadd231ps_fma(auVar83,auVar81,auVar233);
  auVar273._4_4_ = auVar215._0_4_;
  auVar273._0_4_ = auVar215._0_4_;
  auVar273._8_4_ = auVar215._0_4_;
  auVar273._12_4_ = auVar215._0_4_;
  auVar274 = ZEXT1664(auVar273);
  auVar83 = vshufps_avx(auVar215,auVar215,0x55);
  auVar82 = vshufps_avx(auVar215,auVar215,0xaa);
  fVar144 = auVar82._0_4_;
  auVar234._0_4_ = fVar144 * auVar78._0_4_;
  fVar169 = auVar82._4_4_;
  auVar234._4_4_ = fVar169 * auVar78._4_4_;
  fVar241 = auVar82._8_4_;
  auVar234._8_4_ = fVar241 * auVar78._8_4_;
  fVar250 = auVar82._12_4_;
  auVar234._12_4_ = fVar250 * auVar78._12_4_;
  auVar225._0_4_ = auVar80._0_4_ * fVar144;
  auVar225._4_4_ = auVar80._4_4_ * fVar169;
  auVar225._8_4_ = auVar80._8_4_ * fVar241;
  auVar225._12_4_ = auVar80._12_4_ * fVar250;
  auVar216._0_4_ = auVar86._0_4_ * fVar144;
  auVar216._4_4_ = auVar86._4_4_ * fVar169;
  auVar216._8_4_ = auVar86._8_4_ * fVar241;
  auVar216._12_4_ = auVar86._12_4_ * fVar250;
  auVar75 = vfmadd231ps_fma(auVar234,auVar83,auVar75);
  auVar78 = vfmadd231ps_fma(auVar225,auVar83,auVar79);
  auVar79 = vfmadd231ps_fma(auVar216,auVar83,auVar77);
  auVar20 = vfmadd231ps_fma(auVar75,auVar273,auVar76);
  auVar145 = vfmadd231ps_fma(auVar78,auVar273,auVar276);
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  auVar146 = vfmadd231ps_fma(auVar79,auVar273,auVar81);
  auVar76 = vandps_avx(auVar261,auVar87);
  auVar256._8_4_ = 0x219392ef;
  auVar256._0_8_ = 0x219392ef219392ef;
  auVar256._12_4_ = 0x219392ef;
  uVar57 = vcmpps_avx512vl(auVar76,auVar256,1);
  bVar68 = (bool)((byte)uVar57 & 1);
  auVar72._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar87._0_4_;
  bVar68 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar87._4_4_;
  bVar68 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar87._8_4_;
  bVar68 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar87._12_4_;
  auVar76 = vandps_avx(auVar261,auVar84);
  uVar57 = vcmpps_avx512vl(auVar76,auVar256,1);
  bVar68 = (bool)((byte)uVar57 & 1);
  auVar73._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar84._0_4_;
  bVar68 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar84._4_4_;
  bVar68 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar84._8_4_;
  bVar68 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar84._12_4_;
  auVar76 = vandps_avx(auVar261,auVar85);
  uVar57 = vcmpps_avx512vl(auVar76,auVar256,1);
  bVar68 = (bool)((byte)uVar57 & 1);
  auVar74._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._0_4_;
  bVar68 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._4_4_;
  bVar68 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._8_4_;
  bVar68 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar85._12_4_;
  auVar75 = vrcp14ps_avx512vl(auVar72);
  auVar257._8_4_ = 0x3f800000;
  auVar257._0_8_ = &DAT_3f8000003f800000;
  auVar257._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar72,auVar75,auVar257);
  auVar87 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar73);
  auVar76 = vfnmadd213ps_fma(auVar73,auVar75,auVar257);
  auVar85 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar74);
  auVar76 = vfnmadd213ps_fma(auVar74,auVar75,auVar257);
  auVar19 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  fVar144 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar66 + 0x16)) *
            *(float *)(prim + lVar66 + 0x1a);
  auVar242._4_4_ = fVar144;
  auVar242._0_4_ = fVar144;
  auVar242._8_4_ = fVar144;
  auVar242._12_4_ = fVar144;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar76 = vpmovsxwd_avx(auVar76);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar276 = vsubps_avx(auVar75,auVar76);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar78);
  auVar78 = vfmadd213ps_fma(auVar276,auVar242,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar75);
  auVar276._8_8_ = 0;
  auVar276._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar75 = vpmovsxwd_avx(auVar276);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar276 = vfmadd213ps_fma(auVar75,auVar242,auVar76);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar76 = vpmovsxwd_avx(auVar79);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar57 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar70 * 2 + uVar57 + 6);
  auVar75 = vpmovsxwd_avx(auVar80);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar79 = vfmadd213ps_fma(auVar75,auVar242,auVar76);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar57 + 6);
  auVar76 = vpmovsxwd_avx(auVar81);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar75 = vpmovsxwd_avx(auVar77);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar80 = vfmadd213ps_fma(auVar75,auVar242,auVar76);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar76 = vpmovsxwd_avx(auVar86);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar75 = vpmovsxwd_avx(auVar83);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar81 = vfmadd213ps_fma(auVar75,auVar242,auVar76);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar70) + 6);
  auVar76 = vpmovsxwd_avx(auVar82);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar75 = vpmovsxwd_avx(auVar84);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar75 = vfmadd213ps_fma(auVar75,auVar242,auVar76);
  auVar76 = vsubps_avx(auVar78,auVar20);
  auVar243._0_4_ = auVar87._0_4_ * auVar76._0_4_;
  auVar243._4_4_ = auVar87._4_4_ * auVar76._4_4_;
  auVar243._8_4_ = auVar87._8_4_ * auVar76._8_4_;
  auVar243._12_4_ = auVar87._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar276,auVar20);
  auVar192._0_4_ = auVar87._0_4_ * auVar76._0_4_;
  auVar192._4_4_ = auVar87._4_4_ * auVar76._4_4_;
  auVar192._8_4_ = auVar87._8_4_ * auVar76._8_4_;
  auVar192._12_4_ = auVar87._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar79,auVar145);
  auVar235._0_4_ = auVar85._0_4_ * auVar76._0_4_;
  auVar235._4_4_ = auVar85._4_4_ * auVar76._4_4_;
  auVar235._8_4_ = auVar85._8_4_ * auVar76._8_4_;
  auVar235._12_4_ = auVar85._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar80,auVar145);
  auVar171._0_4_ = auVar85._0_4_ * auVar76._0_4_;
  auVar171._4_4_ = auVar85._4_4_ * auVar76._4_4_;
  auVar171._8_4_ = auVar85._8_4_ * auVar76._8_4_;
  auVar171._12_4_ = auVar85._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar81,auVar146);
  auVar226._0_4_ = auVar19._0_4_ * auVar76._0_4_;
  auVar226._4_4_ = auVar19._4_4_ * auVar76._4_4_;
  auVar226._8_4_ = auVar19._8_4_ * auVar76._8_4_;
  auVar226._12_4_ = auVar19._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar75,auVar146);
  auVar147._0_4_ = auVar19._0_4_ * auVar76._0_4_;
  auVar147._4_4_ = auVar19._4_4_ * auVar76._4_4_;
  auVar147._8_4_ = auVar19._8_4_ * auVar76._8_4_;
  auVar147._12_4_ = auVar19._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar243,auVar192);
  auVar75 = vpminsd_avx(auVar235,auVar171);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar75 = vpminsd_avx(auVar226,auVar147);
  uVar240 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar87._4_4_ = uVar240;
  auVar87._0_4_ = uVar240;
  auVar87._8_4_ = uVar240;
  auVar87._12_4_ = uVar240;
  auVar75 = vmaxps_avx512vl(auVar75,auVar87);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar85._8_4_ = 0x3f7ffffa;
  auVar85._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar85._12_4_ = 0x3f7ffffa;
  local_450 = vmulps_avx512vl(auVar76,auVar85);
  auVar76 = vpmaxsd_avx(auVar243,auVar192);
  auVar75 = vpmaxsd_avx(auVar235,auVar171);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar75 = vpmaxsd_avx(auVar226,auVar147);
  uVar240 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar19._4_4_ = uVar240;
  auVar19._0_4_ = uVar240;
  auVar19._8_4_ = uVar240;
  auVar19._12_4_ = uVar240;
  auVar75 = vminps_avx512vl(auVar75,auVar19);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar20._8_4_ = 0x3f800003;
  auVar20._0_8_ = 0x3f8000033f800003;
  auVar20._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar20);
  auVar75 = vpbroadcastd_avx512vl();
  uVar15 = vcmpps_avx512vl(local_450,auVar76,2);
  local_628 = vpcmpgtd_avx512vl(auVar75,_DAT_01ff0cf0);
  local_628 = ((byte)uVar15 & 0xf) & local_628;
  bVar68 = (char)local_628 == '\0';
  local_a5d = !bVar68;
  if (bVar68) {
    return local_a5d;
  }
  local_440 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_630 = prim;
LAB_01c023f8:
  lVar66 = 0;
  for (uVar57 = local_628; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar66 = lVar66 + 1;
  }
  uVar59 = *(uint *)(local_630 + 2);
  pGVar3 = (context->scene->geometries).items[uVar59].ptr;
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_630 + lVar66 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar144 = (pGVar3->time_range).lower;
  fVar144 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar144) / ((pGVar3->time_range).upper - fVar144));
  auVar76 = vroundss_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),9);
  auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
  fVar144 = fVar144 - auVar76._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar65 = (long)(int)auVar76._0_4_ * 0x38;
  lVar66 = *(long *)(_Var4 + 0x10 + lVar65);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar65);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar65);
  pfVar1 = (float *)(lVar5 + uVar57 * lVar6);
  auVar148._0_4_ = fVar144 * *pfVar1;
  auVar148._4_4_ = fVar144 * pfVar1[1];
  auVar148._8_4_ = fVar144 * pfVar1[2];
  auVar148._12_4_ = fVar144 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar57 + 1) * lVar6);
  auVar172._0_4_ = fVar144 * *pfVar1;
  auVar172._4_4_ = fVar144 * pfVar1[1];
  auVar172._8_4_ = fVar144 * pfVar1[2];
  auVar172._12_4_ = fVar144 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar57 + 2) * lVar6);
  auVar193._0_4_ = fVar144 * *pfVar1;
  auVar193._4_4_ = fVar144 * pfVar1[1];
  auVar193._8_4_ = fVar144 * pfVar1[2];
  auVar193._12_4_ = fVar144 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar57 + 3));
  auVar217._0_4_ = fVar144 * *pfVar1;
  auVar217._4_4_ = fVar144 * pfVar1[1];
  auVar217._8_4_ = fVar144 * pfVar1[2];
  auVar217._12_4_ = fVar144 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar65);
  fVar144 = 1.0 - fVar144;
  auVar227._4_4_ = fVar144;
  auVar227._0_4_ = fVar144;
  auVar227._8_4_ = fVar144;
  auVar227._12_4_ = fVar144;
  auVar78 = vfmadd231ps_fma(auVar148,auVar227,*(undefined1 (*) [16])(lVar5 + lVar66 * uVar57));
  auVar276 = vfmadd231ps_fma(auVar172,auVar227,*(undefined1 (*) [16])(lVar5 + lVar66 * (uVar57 + 1))
                            );
  auVar79 = vfmadd231ps_fma(auVar193,auVar227,*(undefined1 (*) [16])(lVar5 + lVar66 * (uVar57 + 2)))
  ;
  auVar80 = vfmadd231ps_fma(auVar217,auVar227,*(undefined1 (*) [16])(lVar5 + lVar66 * (uVar57 + 3)))
  ;
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar75 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_500 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_520 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar76 = vunpcklps_avx512vl(local_500._0_16_,local_520._0_16_);
  _local_540 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar86 = local_540._0_16_;
  local_730 = vinsertps_avx512f(auVar76,auVar86,0x28);
  auVar236._0_4_ = auVar78._0_4_ + auVar276._0_4_ + auVar79._0_4_ + auVar80._0_4_;
  auVar236._4_4_ = auVar78._4_4_ + auVar276._4_4_ + auVar79._4_4_ + auVar80._4_4_;
  auVar236._8_4_ = auVar78._8_4_ + auVar276._8_4_ + auVar79._8_4_ + auVar80._8_4_;
  auVar236._12_4_ = auVar78._12_4_ + auVar276._12_4_ + auVar79._12_4_ + auVar80._12_4_;
  auVar21._8_4_ = 0x3e800000;
  auVar21._0_8_ = 0x3e8000003e800000;
  auVar21._12_4_ = 0x3e800000;
  auVar76 = vmulps_avx512vl(auVar236,auVar21);
  auVar76 = vsubps_avx(auVar76,auVar75);
  auVar76 = vdpps_avx(auVar76,local_730,0x7f);
  fVar144 = *(float *)(ray + k * 4 + 0x60);
  local_740 = vdpps_avx(local_730,local_730,0x7f);
  local_400 = vpbroadcastd_avx512vl();
  auVar244._4_12_ = ZEXT812(0) << 0x20;
  auVar244._0_4_ = local_740._0_4_;
  auVar77 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar244);
  auVar81 = vfnmadd213ss_fma(auVar77,local_740,ZEXT416(0x40000000));
  local_200 = auVar76._0_4_ * auVar77._0_4_ * auVar81._0_4_;
  auVar245._4_4_ = local_200;
  auVar245._0_4_ = local_200;
  auVar245._8_4_ = local_200;
  auVar245._12_4_ = local_200;
  fStack_770 = local_200;
  _local_780 = auVar245;
  fStack_76c = local_200;
  fStack_768 = local_200;
  fStack_764 = local_200;
  auVar76 = vfmadd231ps_fma(auVar75,local_730,auVar245);
  auVar76 = vblendps_avx(auVar76,ZEXT816(0) << 0x40,8);
  auVar75 = vsubps_avx(auVar78,auVar76);
  auVar78 = vsubps_avx(auVar79,auVar76);
  auVar276 = vsubps_avx(auVar276,auVar76);
  auVar76 = vsubps_avx(auVar80,auVar76);
  auVar224 = ZEXT3264(_DAT_02020f20);
  uVar240 = auVar75._0_4_;
  local_220._4_4_ = uVar240;
  local_220._0_4_ = uVar240;
  local_220._8_4_ = uVar240;
  local_220._12_4_ = uVar240;
  local_220._16_4_ = uVar240;
  local_220._20_4_ = uVar240;
  local_220._24_4_ = uVar240;
  local_220._28_4_ = uVar240;
  auVar157._8_4_ = 1;
  auVar157._0_8_ = 0x100000001;
  auVar157._12_4_ = 1;
  auVar157._16_4_ = 1;
  auVar157._20_4_ = 1;
  auVar157._24_4_ = 1;
  auVar157._28_4_ = 1;
  local_5a0 = ZEXT1632(auVar75);
  local_700 = vpermps_avx2(auVar157,local_5a0);
  auVar98._8_4_ = 2;
  auVar98._0_8_ = 0x200000002;
  auVar98._12_4_ = 2;
  auVar98._16_4_ = 2;
  auVar98._20_4_ = 2;
  auVar98._24_4_ = 2;
  auVar98._28_4_ = 2;
  auVar88 = vpermps_avx512vl(auVar98,local_5a0);
  auVar100._8_4_ = 3;
  auVar100._0_8_ = 0x300000003;
  auVar100._12_4_ = 3;
  auVar100._16_4_ = 3;
  auVar100._20_4_ = 3;
  auVar100._24_4_ = 3;
  auVar100._28_4_ = 3;
  auVar89 = vpermps_avx512vl(auVar100,local_5a0);
  uVar240 = auVar276._0_4_;
  local_620._4_4_ = uVar240;
  local_620._0_4_ = uVar240;
  local_620._8_4_ = uVar240;
  local_620._12_4_ = uVar240;
  local_620._16_4_ = uVar240;
  local_620._20_4_ = uVar240;
  local_620._24_4_ = uVar240;
  local_620._28_4_ = uVar240;
  local_5e0 = ZEXT1632(auVar276);
  local_720 = vpermps_avx512vl(auVar157,local_5e0);
  auVar90 = vpermps_avx512vl(auVar98,local_5e0);
  auVar91 = vpermps_avx512vl(auVar100,local_5e0);
  auVar92 = vbroadcastss_avx512vl(auVar78);
  local_5c0 = ZEXT1632(auVar78);
  auVar93 = vpermps_avx512vl(auVar157,local_5c0);
  auVar94 = vpermps_avx512vl(auVar98,local_5c0);
  auVar95 = vpermps_avx512vl(auVar100,local_5c0);
  auVar96 = vbroadcastss_avx512vl(auVar76);
  _local_600 = ZEXT1632(auVar76);
  auVar97 = vpermps_avx512vl(auVar157,_local_600);
  auVar157 = vpermps_avx2(auVar98,_local_600);
  auVar98 = vpermps_avx512vl(auVar100,_local_600);
  auVar232 = ZEXT3264(local_720);
  auVar214 = ZEXT3264(local_620);
  auVar76 = vmulss_avx512f(auVar86,auVar86);
  auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),local_520,local_520);
  local_3c0 = vfmadd231ps_avx512vl(auVar99,local_500,local_500);
  local_1e0._0_4_ = local_3c0._0_4_;
  local_1e0._4_4_ = local_1e0._0_4_;
  local_1e0._8_4_ = local_1e0._0_4_;
  local_1e0._12_4_ = local_1e0._0_4_;
  local_1e0._16_4_ = local_1e0._0_4_;
  local_1e0._20_4_ = local_1e0._0_4_;
  local_1e0._24_4_ = local_1e0._0_4_;
  local_1e0._28_4_ = local_1e0._0_4_;
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar99);
  local_680 = ZEXT416((uint)local_200);
  local_200 = fVar144 - local_200;
  auVar275 = ZEXT3264(local_700);
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1f0 = local_200;
  fStack_1ec = local_200;
  fStack_1e8 = local_200;
  fStack_1e4 = local_200;
  bVar63 = 0;
  fVar169 = 1.4013e-45;
  local_420 = vpbroadcastd_avx512vl();
  auVar76 = vsqrtss_avx(local_740,local_740);
  auVar75 = vsqrtss_avx(local_740,local_740);
  local_6a0 = ZEXT816(0x3f80000000000000);
  uVar57 = 0;
  do {
    auVar78 = vmovshdup_avx(local_6a0);
    auVar239._0_4_ = local_6a0._0_4_;
    fVar241 = auVar78._0_4_ - auVar239._0_4_;
    fVar260 = fVar241 * 0.04761905;
    auVar239._4_4_ = auVar239._0_4_;
    auVar239._8_4_ = auVar239._0_4_;
    auVar239._12_4_ = auVar239._0_4_;
    auVar239._16_4_ = auVar239._0_4_;
    auVar239._20_4_ = auVar239._0_4_;
    auVar239._24_4_ = auVar239._0_4_;
    auVar239._28_4_ = auVar239._0_4_;
    local_760._4_4_ = fVar241;
    local_760._0_4_ = fVar241;
    fStack_758 = fVar241;
    fStack_754 = fVar241;
    register0x00001210 = fVar241;
    register0x00001214 = fVar241;
    register0x00001218 = fVar241;
    register0x0000121c = fVar241;
    auVar78 = vfmadd231ps_fma(auVar239,_local_760,auVar224._0_32_);
    auVar127._8_4_ = 0x3f800000;
    auVar127._0_8_ = &DAT_3f8000003f800000;
    auVar127._12_4_ = 0x3f800000;
    auVar127._16_4_ = 0x3f800000;
    auVar127._20_4_ = 0x3f800000;
    auVar127._24_4_ = 0x3f800000;
    auVar127._28_4_ = 0x3f800000;
    auVar99 = vsubps_avx(auVar127,ZEXT1632(auVar78));
    fVar241 = auVar78._0_4_;
    auVar116._0_4_ = auVar214._0_4_ * fVar241;
    fVar250 = auVar78._4_4_;
    auVar116._4_4_ = auVar214._4_4_ * fVar250;
    fVar251 = auVar78._8_4_;
    auVar116._8_4_ = auVar214._8_4_ * fVar251;
    fVar252 = auVar78._12_4_;
    auVar116._12_4_ = auVar214._12_4_ * fVar252;
    auVar116._16_4_ = auVar214._16_4_ * 0.0;
    auVar116._20_4_ = auVar214._20_4_ * 0.0;
    auVar116._24_4_ = auVar214._24_4_ * 0.0;
    auVar116._28_4_ = 0;
    auVar104 = ZEXT1632(auVar78);
    auVar224._0_4_ = auVar232._0_4_ * fVar241;
    auVar224._4_4_ = auVar232._4_4_ * fVar250;
    auVar224._8_4_ = auVar232._8_4_ * fVar251;
    auVar224._12_4_ = auVar232._12_4_ * fVar252;
    auVar224._16_4_ = auVar232._16_4_ * 0.0;
    auVar224._20_4_ = auVar232._20_4_ * 0.0;
    auVar224._28_36_ = auVar214._28_36_;
    auVar224._24_4_ = auVar232._24_4_ * 0.0;
    auVar100 = vmulps_avx512vl(auVar90,auVar104);
    auVar101 = vmulps_avx512vl(auVar91,auVar104);
    auVar276 = vfmadd231ps_fma(auVar116,auVar99,local_220);
    auVar102 = vfmadd231ps_avx512vl(auVar224._0_32_,auVar99,auVar275._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar88);
    auVar103 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar89);
    auVar101 = vmulps_avx512vl(auVar92,auVar104);
    auVar112 = ZEXT1632(auVar78);
    auVar104 = vmulps_avx512vl(auVar93,auVar112);
    auVar105 = vmulps_avx512vl(auVar94,auVar112);
    auVar106 = vmulps_avx512vl(auVar95,auVar112);
    auVar79 = vfmadd231ps_fma(auVar101,auVar99,auVar214._0_32_);
    auVar80 = vfmadd231ps_fma(auVar104,auVar99,auVar232._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar105,auVar99,auVar90);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar99,auVar91);
    auVar101 = vmulps_avx512vl(auVar96,auVar112);
    auVar104 = vmulps_avx512vl(auVar97,auVar112);
    auVar214._0_4_ = auVar157._0_4_ * fVar241;
    auVar214._4_4_ = auVar157._4_4_ * fVar250;
    auVar214._8_4_ = auVar157._8_4_ * fVar251;
    auVar214._12_4_ = auVar157._12_4_ * fVar252;
    auVar214._16_4_ = auVar157._16_4_ * 0.0;
    auVar214._20_4_ = auVar157._20_4_ * 0.0;
    auVar214._28_36_ = auVar274._28_36_;
    auVar214._24_4_ = auVar157._24_4_ * 0.0;
    auVar105 = vmulps_avx512vl(auVar98,auVar112);
    auVar108 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar92);
    auVar109 = vfmadd231ps_avx512vl(auVar104,auVar99,auVar93);
    auVar110 = vfmadd231ps_avx512vl(auVar214._0_32_,auVar99,auVar94);
    auVar111 = vfmadd231ps_avx512vl(auVar105,auVar99,auVar95);
    auVar101 = vmulps_avx512vl(auVar112,ZEXT1632(auVar79));
    auVar112 = ZEXT1632(auVar78);
    auVar104 = vmulps_avx512vl(auVar112,ZEXT1632(auVar80));
    auVar105 = vmulps_avx512vl(auVar112,auVar107);
    auVar112 = vmulps_avx512vl(auVar112,auVar106);
    auVar113 = vfmadd231ps_avx512vl(auVar101,auVar99,ZEXT1632(auVar276));
    auVar114 = vfmadd231ps_avx512vl(auVar104,auVar99,auVar102);
    auVar115 = vfmadd231ps_avx512vl(auVar105,auVar99,auVar100);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar99,auVar103);
    auVar117._0_4_ = auVar108._0_4_ * fVar241;
    auVar117._4_4_ = auVar108._4_4_ * fVar250;
    auVar117._8_4_ = auVar108._8_4_ * fVar251;
    auVar117._12_4_ = auVar108._12_4_ * fVar252;
    auVar117._16_4_ = auVar108._16_4_ * 0.0;
    auVar117._20_4_ = auVar108._20_4_ * 0.0;
    auVar117._24_4_ = auVar108._24_4_ * 0.0;
    auVar117._28_4_ = 0;
    auVar101._4_4_ = auVar109._4_4_ * fVar250;
    auVar101._0_4_ = auVar109._0_4_ * fVar241;
    auVar101._8_4_ = auVar109._8_4_ * fVar251;
    auVar101._12_4_ = auVar109._12_4_ * fVar252;
    auVar101._16_4_ = auVar109._16_4_ * 0.0;
    auVar101._20_4_ = auVar109._20_4_ * 0.0;
    auVar101._24_4_ = auVar109._24_4_ * 0.0;
    auVar101._28_4_ = auVar108._28_4_;
    auVar104._4_4_ = auVar110._4_4_ * fVar250;
    auVar104._0_4_ = auVar110._0_4_ * fVar241;
    auVar104._8_4_ = auVar110._8_4_ * fVar251;
    auVar104._12_4_ = auVar110._12_4_ * fVar252;
    auVar104._16_4_ = auVar110._16_4_ * 0.0;
    auVar104._20_4_ = auVar110._20_4_ * 0.0;
    auVar104._24_4_ = auVar110._24_4_ * 0.0;
    auVar104._28_4_ = auVar109._28_4_;
    auVar105._4_4_ = auVar111._4_4_ * fVar250;
    auVar105._0_4_ = auVar111._0_4_ * fVar241;
    auVar105._8_4_ = auVar111._8_4_ * fVar251;
    auVar105._12_4_ = auVar111._12_4_ * fVar252;
    auVar105._16_4_ = auVar111._16_4_ * 0.0;
    auVar105._20_4_ = auVar111._20_4_ * 0.0;
    auVar105._24_4_ = auVar111._24_4_ * 0.0;
    auVar105._28_4_ = auVar110._28_4_;
    auVar78 = vfmadd231ps_fma(auVar117,auVar99,ZEXT1632(auVar79));
    auVar276 = vfmadd231ps_fma(auVar101,auVar99,ZEXT1632(auVar80));
    auVar79 = vfmadd231ps_fma(auVar104,auVar99,auVar107);
    auVar80 = vfmadd231ps_fma(auVar105,auVar99,auVar106);
    auVar109._28_4_ = auVar103._28_4_;
    auVar109._0_28_ =
         ZEXT1628(CONCAT412(fVar252 * auVar78._12_4_,
                            CONCAT48(fVar251 * auVar78._8_4_,
                                     CONCAT44(fVar250 * auVar78._4_4_,fVar241 * auVar78._0_4_))));
    auVar110._28_4_ = auVar100._28_4_;
    auVar110._0_28_ =
         ZEXT1628(CONCAT412(auVar276._12_4_ * fVar252,
                            CONCAT48(auVar276._8_4_ * fVar251,
                                     CONCAT44(auVar276._4_4_ * fVar250,auVar276._0_4_ * fVar241))));
    auVar111._28_4_ = auVar102._28_4_;
    auVar111._0_28_ =
         ZEXT1628(CONCAT412(auVar79._12_4_ * fVar252,
                            CONCAT48(auVar79._8_4_ * fVar251,
                                     CONCAT44(auVar79._4_4_ * fVar250,auVar79._0_4_ * fVar241))));
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar99,auVar113);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar99,auVar114);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar99,auVar115);
    auVar101 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar80._12_4_ * fVar252,
                                             CONCAT48(auVar80._8_4_ * fVar251,
                                                      CONCAT44(auVar80._4_4_ * fVar250,
                                                               auVar80._0_4_ * fVar241)))),auVar112,
                          auVar99);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar78),auVar113);
    auVar100 = vsubps_avx512vl(ZEXT1632(auVar276),auVar114);
    auVar104 = vsubps_avx512vl(ZEXT1632(auVar79),auVar115);
    auVar105 = vsubps_avx512vl(ZEXT1632(auVar80),auVar112);
    auVar112._4_4_ = fVar260 * auVar99._4_4_ * 3.0;
    auVar112._0_4_ = fVar260 * auVar99._0_4_ * 3.0;
    auVar112._8_4_ = fVar260 * auVar99._8_4_ * 3.0;
    auVar112._12_4_ = fVar260 * auVar99._12_4_ * 3.0;
    auVar112._16_4_ = fVar260 * auVar99._16_4_ * 3.0;
    auVar112._20_4_ = fVar260 * auVar99._20_4_ * 3.0;
    auVar112._24_4_ = fVar260 * auVar99._24_4_ * 3.0;
    auVar112._28_4_ = auVar106._28_4_;
    auVar128._0_4_ = fVar260 * auVar100._0_4_ * 3.0;
    auVar128._4_4_ = fVar260 * auVar100._4_4_ * 3.0;
    auVar128._8_4_ = fVar260 * auVar100._8_4_ * 3.0;
    auVar128._12_4_ = fVar260 * auVar100._12_4_ * 3.0;
    auVar128._16_4_ = fVar260 * auVar100._16_4_ * 3.0;
    auVar128._20_4_ = fVar260 * auVar100._20_4_ * 3.0;
    auVar128._24_4_ = fVar260 * auVar100._24_4_ * 3.0;
    auVar128._28_4_ = 0;
    auVar129._0_4_ = auVar104._0_4_ * 3.0 * fVar260;
    auVar129._4_4_ = auVar104._4_4_ * 3.0 * fVar260;
    auVar129._8_4_ = auVar104._8_4_ * 3.0 * fVar260;
    auVar129._12_4_ = auVar104._12_4_ * 3.0 * fVar260;
    auVar129._16_4_ = auVar104._16_4_ * 3.0 * fVar260;
    auVar129._20_4_ = auVar104._20_4_ * 3.0 * fVar260;
    auVar129._24_4_ = auVar104._24_4_ * 3.0 * fVar260;
    auVar129._28_4_ = 0;
    fVar241 = auVar105._0_4_ * 3.0 * fVar260;
    fVar250 = auVar105._4_4_ * 3.0 * fVar260;
    auVar113._4_4_ = fVar250;
    auVar113._0_4_ = fVar241;
    fVar251 = auVar105._8_4_ * 3.0 * fVar260;
    auVar113._8_4_ = fVar251;
    fVar252 = auVar105._12_4_ * 3.0 * fVar260;
    auVar113._12_4_ = fVar252;
    fVar253 = auVar105._16_4_ * 3.0 * fVar260;
    auVar113._16_4_ = fVar253;
    fVar254 = auVar105._20_4_ * 3.0 * fVar260;
    auVar113._20_4_ = fVar254;
    fVar255 = auVar105._24_4_ * 3.0 * fVar260;
    auVar113._24_4_ = fVar255;
    auVar113._28_4_ = fVar260;
    auVar276 = auVar97._0_16_;
    auVar78 = vxorps_avx512vl(auVar276,auVar276);
    auVar116 = vpermt2ps_avx512vl(auVar109,_DAT_0205fd20,ZEXT1632(auVar78));
    auVar117 = vpermt2ps_avx512vl(auVar110,_DAT_0205fd20,ZEXT1632(auVar78));
    auVar104 = ZEXT1632(auVar78);
    auVar118 = vpermt2ps_avx512vl(auVar111,_DAT_0205fd20,auVar104);
    auVar119._0_4_ = auVar101._0_4_ + fVar241;
    auVar119._4_4_ = auVar101._4_4_ + fVar250;
    auVar119._8_4_ = auVar101._8_4_ + fVar251;
    auVar119._12_4_ = auVar101._12_4_ + fVar252;
    auVar119._16_4_ = auVar101._16_4_ + fVar253;
    auVar119._20_4_ = auVar101._20_4_ + fVar254;
    auVar119._24_4_ = auVar101._24_4_ + fVar255;
    auVar119._28_4_ = auVar101._28_4_ + fVar260;
    auVar99 = vmaxps_avx(auVar101,auVar119);
    auVar100 = vminps_avx(auVar101,auVar119);
    auVar102 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,auVar104);
    auVar119 = vpermt2ps_avx512vl(auVar112,_DAT_0205fd20,auVar104);
    auVar120 = vpermt2ps_avx512vl(auVar128,_DAT_0205fd20,auVar104);
    auVar125 = ZEXT1632(auVar78);
    auVar121 = vpermt2ps_avx512vl(auVar129,_DAT_0205fd20,auVar125);
    auVar101 = vpermt2ps_avx512vl(auVar113,_DAT_0205fd20,auVar125);
    auVar103 = vsubps_avx512vl(auVar102,auVar101);
    auVar101 = vsubps_avx(auVar116,auVar109);
    auVar104 = vsubps_avx(auVar117,auVar110);
    auVar105 = vsubps_avx(auVar118,auVar111);
    auVar106 = vmulps_avx512vl(auVar104,auVar129);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar128,auVar105);
    auVar107 = vmulps_avx512vl(auVar105,auVar112);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar129,auVar101);
    auVar108 = vmulps_avx512vl(auVar101,auVar128);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar112,auVar104);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar107 = vmulps_avx512vl(auVar105,auVar105);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar104);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar101,auVar101);
    auVar108 = vrcp14ps_avx512vl(auVar107);
    auVar113 = vfnmadd213ps_avx512vl(auVar108,auVar107,auVar127);
    auVar108 = vfmadd132ps_avx512vl(auVar113,auVar108,auVar108);
    auVar106 = vmulps_avx512vl(auVar106,auVar108);
    auVar113 = vmulps_avx512vl(auVar104,auVar121);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar120,auVar105);
    auVar114 = vmulps_avx512vl(auVar105,auVar119);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar121,auVar101);
    auVar115 = vmulps_avx512vl(auVar101,auVar120);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar119,auVar104);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar108 = vmulps_avx512vl(auVar113,auVar108);
    auVar106 = vmaxps_avx512vl(auVar106,auVar108);
    auVar106 = vsqrtps_avx512vl(auVar106);
    auVar108 = vmaxps_avx512vl(auVar103,auVar102);
    auVar99 = vmaxps_avx512vl(auVar99,auVar108);
    auVar108 = vaddps_avx512vl(auVar106,auVar99);
    auVar99 = vminps_avx512vl(auVar103,auVar102);
    auVar99 = vminps_avx(auVar100,auVar99);
    auVar99 = vsubps_avx512vl(auVar99,auVar106);
    auVar102._8_4_ = 0x3f800002;
    auVar102._0_8_ = 0x3f8000023f800002;
    auVar102._12_4_ = 0x3f800002;
    auVar102._16_4_ = 0x3f800002;
    auVar102._20_4_ = 0x3f800002;
    auVar102._24_4_ = 0x3f800002;
    auVar102._28_4_ = 0x3f800002;
    auVar100 = vmulps_avx512vl(auVar108,auVar102);
    auVar103._8_4_ = 0x3f7ffffc;
    auVar103._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar103._12_4_ = 0x3f7ffffc;
    auVar103._16_4_ = 0x3f7ffffc;
    auVar103._20_4_ = 0x3f7ffffc;
    auVar103._24_4_ = 0x3f7ffffc;
    auVar103._28_4_ = 0x3f7ffffc;
    auVar99 = vmulps_avx512vl(auVar99,auVar103);
    auVar114._4_4_ = auVar100._4_4_ * auVar100._4_4_;
    auVar114._0_4_ = auVar100._0_4_ * auVar100._0_4_;
    auVar114._8_4_ = auVar100._8_4_ * auVar100._8_4_;
    auVar114._12_4_ = auVar100._12_4_ * auVar100._12_4_;
    auVar114._16_4_ = auVar100._16_4_ * auVar100._16_4_;
    auVar114._20_4_ = auVar100._20_4_ * auVar100._20_4_;
    auVar114._24_4_ = auVar100._24_4_ * auVar100._24_4_;
    auVar114._28_4_ = auVar99._28_4_;
    auVar100 = vrsqrt14ps_avx512vl(auVar107);
    auVar106._8_4_ = 0xbf000000;
    auVar106._0_8_ = 0xbf000000bf000000;
    auVar106._12_4_ = 0xbf000000;
    auVar106._16_4_ = 0xbf000000;
    auVar106._20_4_ = 0xbf000000;
    auVar106._24_4_ = 0xbf000000;
    auVar106._28_4_ = 0xbf000000;
    auVar102 = vmulps_avx512vl(auVar107,auVar106);
    auVar115._4_4_ = auVar100._4_4_ * auVar102._4_4_;
    auVar115._0_4_ = auVar100._0_4_ * auVar102._0_4_;
    auVar115._8_4_ = auVar100._8_4_ * auVar102._8_4_;
    auVar115._12_4_ = auVar100._12_4_ * auVar102._12_4_;
    auVar115._16_4_ = auVar100._16_4_ * auVar102._16_4_;
    auVar115._20_4_ = auVar100._20_4_ * auVar102._20_4_;
    auVar115._24_4_ = auVar100._24_4_ * auVar102._24_4_;
    auVar115._28_4_ = auVar102._28_4_;
    auVar102 = vmulps_avx512vl(auVar100,auVar100);
    auVar102 = vmulps_avx512vl(auVar102,auVar115);
    auVar107._8_4_ = 0x3fc00000;
    auVar107._0_8_ = 0x3fc000003fc00000;
    auVar107._12_4_ = 0x3fc00000;
    auVar107._16_4_ = 0x3fc00000;
    auVar107._20_4_ = 0x3fc00000;
    auVar107._24_4_ = 0x3fc00000;
    auVar107._28_4_ = 0x3fc00000;
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar107);
    auVar274 = ZEXT3264(auVar102);
    auVar123._4_4_ = auVar102._4_4_ * auVar101._4_4_;
    auVar123._0_4_ = auVar102._0_4_ * auVar101._0_4_;
    auVar123._8_4_ = auVar102._8_4_ * auVar101._8_4_;
    auVar123._12_4_ = auVar102._12_4_ * auVar101._12_4_;
    auVar123._16_4_ = auVar102._16_4_ * auVar101._16_4_;
    auVar123._20_4_ = auVar102._20_4_ * auVar101._20_4_;
    auVar123._24_4_ = auVar102._24_4_ * auVar101._24_4_;
    auVar123._28_4_ = auVar100._28_4_;
    auVar100 = vmulps_avx512vl(auVar104,auVar102);
    auVar103 = vmulps_avx512vl(auVar105,auVar102);
    auVar106 = vsubps_avx512vl(auVar125,auVar109);
    auVar107 = vsubps_avx512vl(auVar125,auVar110);
    auVar113 = vsubps_avx512vl(auVar125,auVar111);
    auVar108 = vmulps_avx512vl(_local_540,auVar113);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_520,auVar107);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_500,auVar106);
    auVar115 = vmulps_avx512vl(auVar113,auVar113);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar107,auVar107);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar106,auVar106);
    auVar122 = vmulps_avx512vl(_local_540,auVar103);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar100,local_520);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar123,local_500);
    auVar103 = vmulps_avx512vl(auVar113,auVar103);
    auVar100 = vfmadd231ps_avx512vl(auVar103,auVar107,auVar100);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,auVar123);
    local_560 = vmulps_avx512vl(auVar122,auVar122);
    auVar103 = vsubps_avx512vl(local_1e0,local_560);
    auVar123 = vmulps_avx512vl(auVar122,auVar100);
    auVar108 = vsubps_avx512vl(auVar108,auVar123);
    auVar123 = vaddps_avx512vl(auVar108,auVar108);
    auVar108 = vmulps_avx512vl(auVar100,auVar100);
    local_6e0 = vsubps_avx512vl(auVar115,auVar108);
    auVar114 = vsubps_avx512vl(local_6e0,auVar114);
    auVar115 = vmulps_avx512vl(auVar123,auVar123);
    auVar108._8_4_ = 0x40800000;
    auVar108._0_8_ = 0x4080000040800000;
    auVar108._12_4_ = 0x40800000;
    auVar108._16_4_ = 0x40800000;
    auVar108._20_4_ = 0x40800000;
    auVar108._24_4_ = 0x40800000;
    auVar108._28_4_ = 0x40800000;
    auVar108 = vmulps_avx512vl(auVar103,auVar108);
    auVar124 = vmulps_avx512vl(auVar108,auVar114);
    auVar124 = vsubps_avx512vl(auVar115,auVar124);
    uVar70 = vcmpps_avx512vl(auVar124,auVar125,5);
    bVar58 = (byte)uVar70;
    if (bVar58 == 0) {
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar124 = vsqrtps_avx512vl(auVar124);
      auVar125 = vaddps_avx512vl(auVar103,auVar103);
      auVar126 = vrcp14ps_avx512vl(auVar125);
      auVar127 = vfnmadd213ps_avx512vl(auVar125,auVar126,auVar127);
      auVar127 = vfmadd132ps_avx512vl(auVar127,auVar126,auVar126);
      auVar126._8_4_ = 0x80000000;
      auVar126._0_8_ = 0x8000000080000000;
      auVar126._12_4_ = 0x80000000;
      auVar126._16_4_ = 0x80000000;
      auVar126._20_4_ = 0x80000000;
      auVar126._24_4_ = 0x80000000;
      auVar126._28_4_ = 0x80000000;
      auVar125 = vxorps_avx512vl(auVar123,auVar126);
      auVar125 = vsubps_avx512vl(auVar125,auVar124);
      auVar125 = vmulps_avx512vl(auVar125,auVar127);
      auVar124 = vsubps_avx512vl(auVar124,auVar123);
      auVar127 = vmulps_avx512vl(auVar124,auVar127);
      auVar124 = vfmadd213ps_avx512vl(auVar122,auVar125,auVar100);
      local_480 = vmulps_avx512vl(auVar102,auVar124);
      auVar124 = vfmadd213ps_avx512vl(auVar122,auVar127,auVar100);
      local_4a0 = vmulps_avx512vl(auVar102,auVar124);
      auVar158._8_4_ = 0x7f800000;
      auVar158._0_8_ = 0x7f8000007f800000;
      auVar158._12_4_ = 0x7f800000;
      auVar158._16_4_ = 0x7f800000;
      auVar158._20_4_ = 0x7f800000;
      auVar158._24_4_ = 0x7f800000;
      auVar158._28_4_ = 0x7f800000;
      auVar125 = vblendmps_avx512vl(auVar158,auVar125);
      auVar124._0_4_ =
           (uint)(bVar58 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar58 & 1) * local_4a0._0_4_;
      bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar68 * auVar125._4_4_ | (uint)!bVar68 * local_4a0._4_4_;
      bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar68 * auVar125._8_4_ | (uint)!bVar68 * local_4a0._8_4_;
      bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar68 * auVar125._12_4_ | (uint)!bVar68 * local_4a0._12_4_;
      bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar68 * auVar125._16_4_ | (uint)!bVar68 * local_4a0._16_4_;
      bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar68 * auVar125._20_4_ | (uint)!bVar68 * local_4a0._20_4_;
      bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar68 * auVar125._24_4_ | (uint)!bVar68 * local_4a0._24_4_;
      bVar68 = SUB81(uVar70 >> 7,0);
      auVar124._28_4_ = (uint)bVar68 * auVar125._28_4_ | (uint)!bVar68 * local_4a0._28_4_;
      auVar159._8_4_ = 0xff800000;
      auVar159._0_8_ = 0xff800000ff800000;
      auVar159._12_4_ = 0xff800000;
      auVar159._16_4_ = 0xff800000;
      auVar159._20_4_ = 0xff800000;
      auVar159._24_4_ = 0xff800000;
      auVar159._28_4_ = 0xff800000;
      auVar126 = vblendmps_avx512vl(auVar159,auVar127);
      auVar125._0_4_ =
           (uint)(bVar58 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar127._0_4_;
      bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar68 * auVar126._4_4_ | (uint)!bVar68 * auVar127._4_4_;
      bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar68 * auVar126._8_4_ | (uint)!bVar68 * auVar127._8_4_;
      bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar68 * auVar126._12_4_ | (uint)!bVar68 * auVar127._12_4_;
      bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar68 * auVar126._16_4_ | (uint)!bVar68 * auVar127._16_4_;
      bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar68 * auVar126._20_4_ | (uint)!bVar68 * auVar127._20_4_;
      bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar68 * auVar126._24_4_ | (uint)!bVar68 * auVar127._24_4_;
      bVar68 = SUB81(uVar70 >> 7,0);
      auVar125._28_4_ = (uint)bVar68 * auVar126._28_4_ | (uint)!bVar68 * auVar127._28_4_;
      auVar160._8_4_ = 0x7fffffff;
      auVar160._0_8_ = 0x7fffffff7fffffff;
      auVar160._12_4_ = 0x7fffffff;
      auVar160._16_4_ = 0x7fffffff;
      auVar160._20_4_ = 0x7fffffff;
      auVar160._24_4_ = 0x7fffffff;
      auVar160._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_560,auVar160);
      auVar127 = vmaxps_avx512vl(local_3c0,auVar125);
      auVar130._8_4_ = 0x36000000;
      auVar130._0_8_ = 0x3600000036000000;
      auVar130._12_4_ = 0x36000000;
      auVar130._16_4_ = 0x36000000;
      auVar130._20_4_ = 0x36000000;
      auVar130._24_4_ = 0x36000000;
      auVar130._28_4_ = 0x36000000;
      auVar126 = vmulps_avx512vl(auVar127,auVar130);
      auVar127 = vandps_avx(auVar103,auVar160);
      uVar60 = vcmpps_avx512vl(auVar127,auVar126,1);
      uVar70 = uVar70 & uVar60;
      bVar62 = (byte)uVar70;
      if (bVar62 != 0) {
        uVar60 = vcmpps_avx512vl(auVar114,_DAT_02020f00,2);
        auVar185._8_4_ = 0xff800000;
        auVar185._0_8_ = 0xff800000ff800000;
        auVar185._12_4_ = 0xff800000;
        auVar185._16_4_ = 0xff800000;
        auVar185._20_4_ = 0xff800000;
        auVar185._24_4_ = 0xff800000;
        auVar185._28_4_ = 0xff800000;
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar126 = vblendmps_avx512vl(auVar114,auVar185);
        bVar56 = (byte)uVar60;
        uVar71 = (uint)(bVar56 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar127._0_4_;
        bVar68 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar137 = (uint)bVar68 * auVar126._4_4_ | (uint)!bVar68 * auVar127._4_4_;
        bVar68 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar138 = (uint)bVar68 * auVar126._8_4_ | (uint)!bVar68 * auVar127._8_4_;
        bVar68 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar139 = (uint)bVar68 * auVar126._12_4_ | (uint)!bVar68 * auVar127._12_4_;
        bVar68 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar140 = (uint)bVar68 * auVar126._16_4_ | (uint)!bVar68 * auVar127._16_4_;
        bVar68 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar141 = (uint)bVar68 * auVar126._20_4_ | (uint)!bVar68 * auVar127._20_4_;
        bVar68 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar142 = (uint)bVar68 * auVar126._24_4_ | (uint)!bVar68 * auVar127._24_4_;
        bVar68 = SUB81(uVar60 >> 7,0);
        uVar143 = (uint)bVar68 * auVar126._28_4_ | (uint)!bVar68 * auVar127._28_4_;
        auVar124._0_4_ = (bVar62 & 1) * uVar71 | !(bool)(bVar62 & 1) * auVar124._0_4_;
        bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar124._4_4_ = bVar68 * uVar137 | !bVar68 * auVar124._4_4_;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar124._8_4_ = bVar68 * uVar138 | !bVar68 * auVar124._8_4_;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar124._12_4_ = bVar68 * uVar139 | !bVar68 * auVar124._12_4_;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar124._16_4_ = bVar68 * uVar140 | !bVar68 * auVar124._16_4_;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar124._20_4_ = bVar68 * uVar141 | !bVar68 * auVar124._20_4_;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar124._24_4_ = bVar68 * uVar142 | !bVar68 * auVar124._24_4_;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar124._28_4_ = bVar68 * uVar143 | !bVar68 * auVar124._28_4_;
        auVar114 = vblendmps_avx512vl(auVar185,auVar114);
        bVar68 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar14 = SUB81(uVar60 >> 7,0);
        auVar125._0_4_ =
             (uint)(bVar62 & 1) *
             ((uint)(bVar56 & 1) * auVar114._0_4_ | !(bool)(bVar56 & 1) * uVar71) |
             !(bool)(bVar62 & 1) * auVar125._0_4_;
        bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar125._4_4_ =
             (uint)bVar8 * ((uint)bVar68 * auVar114._4_4_ | !bVar68 * uVar137) |
             !bVar8 * auVar125._4_4_;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar125._8_4_ =
             (uint)bVar68 * ((uint)bVar9 * auVar114._8_4_ | !bVar9 * uVar138) |
             !bVar68 * auVar125._8_4_;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar125._12_4_ =
             (uint)bVar68 * ((uint)bVar10 * auVar114._12_4_ | !bVar10 * uVar139) |
             !bVar68 * auVar125._12_4_;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar125._16_4_ =
             (uint)bVar68 * ((uint)bVar11 * auVar114._16_4_ | !bVar11 * uVar140) |
             !bVar68 * auVar125._16_4_;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar125._20_4_ =
             (uint)bVar68 * ((uint)bVar12 * auVar114._20_4_ | !bVar12 * uVar141) |
             !bVar68 * auVar125._20_4_;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar125._24_4_ =
             (uint)bVar68 * ((uint)bVar13 * auVar114._24_4_ | !bVar13 * uVar142) |
             !bVar68 * auVar125._24_4_;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar125._28_4_ =
             (uint)bVar68 * ((uint)bVar14 * auVar114._28_4_ | !bVar14 * uVar143) |
             !bVar68 * auVar125._28_4_;
        bVar58 = (~bVar62 | bVar56) & bVar58;
      }
    }
    fVar241 = (float)local_780._0_4_;
    fVar250 = (float)local_780._4_4_;
    fVar251 = fStack_778;
    fVar252 = fStack_774;
    fVar260 = fStack_770;
    fVar253 = fStack_76c;
    fVar254 = fStack_768;
    fVar255 = fStack_764;
    if ((bVar58 & 0x7f) == 0) {
LAB_01c03153:
      auVar224 = ZEXT3264(_DAT_02020f20);
      auVar275 = ZEXT3264(local_700);
      auVar214 = ZEXT3264(local_620);
      auVar232 = ZEXT3264(local_720);
    }
    else {
      fVar263 = *(float *)(ray + k * 4 + 0x100) - (float)local_680._0_4_;
      auVar161._4_4_ = fVar263;
      auVar161._0_4_ = fVar263;
      auVar161._8_4_ = fVar263;
      auVar161._12_4_ = fVar263;
      auVar161._16_4_ = fVar263;
      auVar161._20_4_ = fVar263;
      auVar161._24_4_ = fVar263;
      auVar161._28_4_ = fVar263;
      auVar114 = vminps_avx512vl(auVar161,auVar125);
      auVar54._4_4_ = fStack_1fc;
      auVar54._0_4_ = local_200;
      auVar54._8_4_ = fStack_1f8;
      auVar54._12_4_ = fStack_1f4;
      auVar54._16_4_ = fStack_1f0;
      auVar54._20_4_ = fStack_1ec;
      auVar54._24_4_ = fStack_1e8;
      auVar54._28_4_ = fStack_1e4;
      auVar124 = vmaxps_avx512vl(auVar54,auVar124);
      auVar113 = vmulps_avx512vl(auVar113,auVar129);
      auVar107 = vfmadd213ps_avx512vl(auVar107,auVar128,auVar113);
      auVar106 = vfmadd213ps_avx512vl(auVar106,auVar112,auVar107);
      auVar107 = vmulps_avx512vl(_local_540,auVar129);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_520,auVar128);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_500,auVar112);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar112);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar112,auVar113,1);
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar106 = vxorps_avx512vl(auVar106,auVar127);
      auVar128 = vrcp14ps_avx512vl(auVar107);
      auVar129 = vxorps_avx512vl(auVar107,auVar127);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar126 = vfnmadd213ps_avx512vl(auVar128,auVar107,auVar125);
      auVar126 = vfmadd132ps_avx512vl(auVar126,auVar128,auVar128);
      auVar126 = vmulps_avx512vl(auVar126,auVar106);
      uVar16 = vcmpps_avx512vl(auVar107,auVar129,1);
      bVar62 = (byte)uVar15 | (byte)uVar16;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar106 = vblendmps_avx512vl(auVar126,auVar130);
      auVar131._0_4_ =
           (uint)(bVar62 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar128._0_4_;
      bVar68 = (bool)(bVar62 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar68 * auVar106._4_4_ | (uint)!bVar68 * auVar128._4_4_;
      bVar68 = (bool)(bVar62 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar68 * auVar106._8_4_ | (uint)!bVar68 * auVar128._8_4_;
      bVar68 = (bool)(bVar62 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar68 * auVar106._12_4_ | (uint)!bVar68 * auVar128._12_4_;
      bVar68 = (bool)(bVar62 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar68 * auVar106._16_4_ | (uint)!bVar68 * auVar128._16_4_;
      bVar68 = (bool)(bVar62 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar68 * auVar106._20_4_ | (uint)!bVar68 * auVar128._20_4_;
      bVar68 = (bool)(bVar62 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar68 * auVar106._24_4_ | (uint)!bVar68 * auVar128._24_4_;
      auVar131._28_4_ =
           (uint)(bVar62 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar128._28_4_;
      auVar106 = vmaxps_avx(auVar124,auVar131);
      uVar16 = vcmpps_avx512vl(auVar107,auVar129,6);
      bVar62 = (byte)uVar15 | (byte)uVar16;
      auVar132._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * auVar126._0_4_;
      bVar68 = (bool)(bVar62 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar126._4_4_;
      bVar68 = (bool)(bVar62 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar126._8_4_;
      bVar68 = (bool)(bVar62 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar126._12_4_;
      bVar68 = (bool)(bVar62 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar126._16_4_;
      bVar68 = (bool)(bVar62 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar126._20_4_;
      bVar68 = (bool)(bVar62 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * auVar126._24_4_;
      auVar132._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar126._28_4_;
      auVar107 = vminps_avx(auVar114,auVar132);
      auVar78 = vxorps_avx512vl(auVar129._0_16_,auVar129._0_16_);
      auVar114 = vsubps_avx512vl(ZEXT1632(auVar78),auVar116);
      auVar116 = vsubps_avx512vl(ZEXT1632(auVar78),auVar117);
      auVar124 = ZEXT1632(auVar78);
      auVar117 = vsubps_avx512vl(auVar124,auVar118);
      auVar117 = vmulps_avx512vl(auVar117,auVar121);
      auVar116 = vfnmsub231ps_avx512vl(auVar117,auVar120,auVar116);
      auVar114 = vfnmadd231ps_avx512vl(auVar116,auVar119,auVar114);
      auVar116 = vmulps_avx512vl(_local_540,auVar121);
      auVar116 = vfnmsub231ps_avx512vl(auVar116,local_520,auVar120);
      auVar116 = vfnmadd231ps_avx512vl(auVar116,local_500,auVar119);
      vandps_avx512vl(auVar116,auVar112);
      uVar15 = vcmpps_avx512vl(auVar116,auVar113,1);
      auVar112 = vxorps_avx512vl(auVar114,auVar127);
      auVar113 = vrcp14ps_avx512vl(auVar116);
      auVar114 = vxorps_avx512vl(auVar116,auVar127);
      auVar117 = vfnmadd213ps_avx512vl(auVar113,auVar116,auVar125);
      auVar78 = vfmadd132ps_fma(auVar117,auVar113,auVar113);
      fVar263 = auVar78._0_4_ * auVar112._0_4_;
      fVar265 = auVar78._4_4_ * auVar112._4_4_;
      auVar118._4_4_ = fVar265;
      auVar118._0_4_ = fVar263;
      fVar266 = auVar78._8_4_ * auVar112._8_4_;
      auVar118._8_4_ = fVar266;
      fVar267 = auVar78._12_4_ * auVar112._12_4_;
      auVar118._12_4_ = fVar267;
      fVar268 = auVar112._16_4_ * 0.0;
      auVar118._16_4_ = fVar268;
      fVar269 = auVar112._20_4_ * 0.0;
      auVar118._20_4_ = fVar269;
      fVar270 = auVar112._24_4_ * 0.0;
      auVar118._24_4_ = fVar270;
      auVar118._28_4_ = auVar112._28_4_;
      uVar16 = vcmpps_avx512vl(auVar116,auVar114,1);
      bVar62 = (byte)uVar15 | (byte)uVar16;
      auVar117 = vblendmps_avx512vl(auVar118,auVar130);
      auVar121._0_4_ =
           (uint)(bVar62 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar113._0_4_;
      bVar68 = (bool)(bVar62 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar68 * auVar117._4_4_ | (uint)!bVar68 * auVar113._4_4_;
      bVar68 = (bool)(bVar62 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar68 * auVar117._8_4_ | (uint)!bVar68 * auVar113._8_4_;
      bVar68 = (bool)(bVar62 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar68 * auVar117._12_4_ | (uint)!bVar68 * auVar113._12_4_;
      bVar68 = (bool)(bVar62 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar68 * auVar117._16_4_ | (uint)!bVar68 * auVar113._16_4_;
      bVar68 = (bool)(bVar62 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar68 * auVar117._20_4_ | (uint)!bVar68 * auVar113._20_4_;
      bVar68 = (bool)(bVar62 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar68 * auVar117._24_4_ | (uint)!bVar68 * auVar113._24_4_;
      auVar121._28_4_ =
           (uint)(bVar62 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar113._28_4_;
      _local_580 = vmaxps_avx(auVar106,auVar121);
      uVar16 = vcmpps_avx512vl(auVar116,auVar114,6);
      bVar62 = (byte)uVar15 | (byte)uVar16;
      auVar133._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * (int)fVar263;
      bVar68 = (bool)(bVar62 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar265;
      bVar68 = (bool)(bVar62 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar266;
      bVar68 = (bool)(bVar62 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar267;
      bVar68 = (bool)(bVar62 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar268;
      bVar68 = (bool)(bVar62 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar269;
      bVar68 = (bool)(bVar62 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar68 * 0x7f800000 | (uint)!bVar68 * (int)fVar270;
      auVar133._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar112._28_4_;
      local_260 = vminps_avx(auVar107,auVar133);
      uVar15 = vcmpps_avx512vl(_local_580,local_260,2);
      bVar58 = bVar58 & 0x7f & (byte)uVar15;
      if (bVar58 == 0) goto LAB_01c03153;
      auVar106 = vmaxps_avx512vl(auVar124,auVar99);
      auVar99 = vminps_avx512vl(local_480,auVar125);
      auVar45 = ZEXT412(0);
      auVar107 = ZEXT1232(auVar45) << 0x20;
      auVar99 = vmaxps_avx(auVar99,ZEXT1232(auVar45) << 0x20);
      auVar112 = vminps_avx512vl(local_4a0,auVar125);
      auVar37._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar37._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar37._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar37._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar37._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar37._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar37._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar37._28_4_ = auVar99._28_4_ + 7.0;
      local_480 = vfmadd213ps_avx512vl(auVar37,_local_760,auVar239);
      auVar99 = vmaxps_avx(auVar112,ZEXT1232(auVar45) << 0x20);
      auVar38._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar38._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar38._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar38._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar38._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar38._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar38._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar38._28_4_ = auVar99._28_4_ + 7.0;
      local_4a0 = vfmadd213ps_avx512vl(auVar38,_local_760,auVar239);
      auVar39._4_4_ = auVar106._4_4_ * auVar106._4_4_;
      auVar39._0_4_ = auVar106._0_4_ * auVar106._0_4_;
      auVar39._8_4_ = auVar106._8_4_ * auVar106._8_4_;
      auVar39._12_4_ = auVar106._12_4_ * auVar106._12_4_;
      auVar39._16_4_ = auVar106._16_4_ * auVar106._16_4_;
      auVar39._20_4_ = auVar106._20_4_ * auVar106._20_4_;
      auVar39._24_4_ = auVar106._24_4_ * auVar106._24_4_;
      auVar39._28_4_ = local_4a0._28_4_;
      auVar99 = vsubps_avx(local_6e0,auVar39);
      local_8c0 = auVar108._0_4_;
      fStack_8bc = auVar108._4_4_;
      fStack_8b8 = auVar108._8_4_;
      fStack_8b4 = auVar108._12_4_;
      fStack_8b0 = auVar108._16_4_;
      fStack_8ac = auVar108._20_4_;
      fStack_8a8 = auVar108._24_4_;
      auVar40._4_4_ = auVar99._4_4_ * fStack_8bc;
      auVar40._0_4_ = auVar99._0_4_ * local_8c0;
      auVar40._8_4_ = auVar99._8_4_ * fStack_8b8;
      auVar40._12_4_ = auVar99._12_4_ * fStack_8b4;
      auVar40._16_4_ = auVar99._16_4_ * fStack_8b0;
      auVar40._20_4_ = auVar99._20_4_ * fStack_8ac;
      auVar40._24_4_ = auVar99._24_4_ * fStack_8a8;
      auVar40._28_4_ = local_4a0._28_4_;
      auVar106 = vsubps_avx(auVar115,auVar40);
      uVar15 = vcmpps_avx512vl(auVar106,ZEXT1232(auVar45) << 0x20,5);
      bVar62 = (byte)uVar15;
      if (bVar62 == 0) {
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar214 = ZEXT864(0) << 0x20;
        auVar106 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar108 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar264 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar120._8_4_ = 0x7f800000;
        auVar120._0_8_ = 0x7f8000007f800000;
        auVar120._12_4_ = 0x7f800000;
        auVar120._16_4_ = 0x7f800000;
        auVar120._20_4_ = 0x7f800000;
        auVar120._24_4_ = 0x7f800000;
        auVar120._28_4_ = 0x7f800000;
        auVar122._8_4_ = 0xff800000;
        auVar122._0_8_ = 0xff800000ff800000;
        auVar122._12_4_ = 0xff800000;
        auVar122._16_4_ = 0xff800000;
        auVar122._20_4_ = 0xff800000;
        auVar122._24_4_ = 0xff800000;
        auVar122._28_4_ = 0xff800000;
      }
      else {
        auVar79 = vxorps_avx512vl(auVar120._0_16_,auVar120._0_16_);
        uVar70 = vcmpps_avx512vl(auVar106,auVar124,5);
        auVar106 = vsqrtps_avx(auVar106);
        auVar186._0_4_ = auVar103._0_4_ + auVar103._0_4_;
        auVar186._4_4_ = auVar103._4_4_ + auVar103._4_4_;
        auVar186._8_4_ = auVar103._8_4_ + auVar103._8_4_;
        auVar186._12_4_ = auVar103._12_4_ + auVar103._12_4_;
        auVar186._16_4_ = auVar103._16_4_ + auVar103._16_4_;
        auVar186._20_4_ = auVar103._20_4_ + auVar103._20_4_;
        auVar186._24_4_ = auVar103._24_4_ + auVar103._24_4_;
        auVar186._28_4_ = auVar103._28_4_ + auVar103._28_4_;
        auVar107 = vrcp14ps_avx512vl(auVar186);
        auVar108 = vfnmadd213ps_avx512vl(auVar186,auVar107,auVar125);
        auVar78 = vfmadd132ps_fma(auVar108,auVar107,auVar107);
        auVar29._8_4_ = 0x80000000;
        auVar29._0_8_ = 0x8000000080000000;
        auVar29._12_4_ = 0x80000000;
        auVar29._16_4_ = 0x80000000;
        auVar29._20_4_ = 0x80000000;
        auVar29._24_4_ = 0x80000000;
        auVar29._28_4_ = 0x80000000;
        auVar107 = vxorps_avx512vl(auVar123,auVar29);
        auVar107 = vsubps_avx(auVar107,auVar106);
        auVar41._4_4_ = auVar107._4_4_ * auVar78._4_4_;
        auVar41._0_4_ = auVar107._0_4_ * auVar78._0_4_;
        auVar41._8_4_ = auVar107._8_4_ * auVar78._8_4_;
        auVar41._12_4_ = auVar107._12_4_ * auVar78._12_4_;
        auVar41._16_4_ = auVar107._16_4_ * 0.0;
        auVar41._20_4_ = auVar107._20_4_ * 0.0;
        auVar41._24_4_ = auVar107._24_4_ * 0.0;
        auVar41._28_4_ = 0x3e000000;
        auVar106 = vsubps_avx512vl(auVar106,auVar123);
        auVar42._4_4_ = auVar106._4_4_ * auVar78._4_4_;
        auVar42._0_4_ = auVar106._0_4_ * auVar78._0_4_;
        auVar42._8_4_ = auVar106._8_4_ * auVar78._8_4_;
        auVar42._12_4_ = auVar106._12_4_ * auVar78._12_4_;
        auVar42._16_4_ = auVar106._16_4_ * 0.0;
        auVar42._20_4_ = auVar106._20_4_ * 0.0;
        auVar42._24_4_ = auVar106._24_4_ * 0.0;
        auVar42._28_4_ = auVar239._0_4_;
        auVar106 = vfmadd213ps_avx512vl(auVar122,auVar41,auVar100);
        auVar43._4_4_ = auVar102._4_4_ * auVar106._4_4_;
        auVar43._0_4_ = auVar102._0_4_ * auVar106._0_4_;
        auVar43._8_4_ = auVar102._8_4_ * auVar106._8_4_;
        auVar43._12_4_ = auVar102._12_4_ * auVar106._12_4_;
        auVar43._16_4_ = auVar102._16_4_ * auVar106._16_4_;
        auVar43._20_4_ = auVar102._20_4_ * auVar106._20_4_;
        auVar43._24_4_ = auVar102._24_4_ * auVar106._24_4_;
        auVar43._28_4_ = auVar107._28_4_;
        auVar106 = vmulps_avx512vl(local_500,auVar41);
        auVar107 = vmulps_avx512vl(local_520,auVar41);
        auVar112 = vmulps_avx512vl(_local_540,auVar41);
        auVar108 = vfmadd213ps_avx512vl(auVar101,auVar43,auVar109);
        auVar106 = vsubps_avx512vl(auVar106,auVar108);
        auVar108 = vfmadd213ps_avx512vl(auVar104,auVar43,auVar110);
        auVar108 = vsubps_avx512vl(auVar107,auVar108);
        auVar78 = vfmadd213ps_fma(auVar43,auVar105,auVar111);
        auVar107 = vsubps_avx(auVar112,ZEXT1632(auVar78));
        auVar264 = auVar107._0_28_;
        auVar100 = vfmadd213ps_avx512vl(auVar122,auVar42,auVar100);
        auVar102 = vmulps_avx512vl(auVar102,auVar100);
        auVar274 = ZEXT3264(auVar102);
        auVar100 = vmulps_avx512vl(local_500,auVar42);
        auVar112 = vmulps_avx512vl(local_520,auVar42);
        auVar113 = vmulps_avx512vl(_local_540,auVar42);
        auVar78 = vfmadd213ps_fma(auVar101,auVar102,auVar109);
        auVar107 = vsubps_avx(auVar100,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar104,auVar102,auVar110);
        auVar100 = vsubps_avx512vl(auVar112,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar105,auVar102,auVar111);
        auVar101 = vsubps_avx512vl(auVar113,ZEXT1632(auVar78));
        auVar214 = ZEXT3264(auVar101);
        auVar208._8_4_ = 0x7f800000;
        auVar208._0_8_ = 0x7f8000007f800000;
        auVar208._12_4_ = 0x7f800000;
        auVar208._16_4_ = 0x7f800000;
        auVar208._20_4_ = 0x7f800000;
        auVar208._24_4_ = 0x7f800000;
        auVar208._28_4_ = 0x7f800000;
        auVar101 = vblendmps_avx512vl(auVar208,auVar41);
        bVar68 = (bool)((byte)uVar70 & 1);
        auVar120._0_4_ = (uint)bVar68 * auVar101._0_4_ | (uint)!bVar68 * auVar109._0_4_;
        bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar68 * auVar101._4_4_ | (uint)!bVar68 * auVar109._4_4_;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar68 * auVar101._8_4_ | (uint)!bVar68 * auVar109._8_4_;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar68 * auVar101._12_4_ | (uint)!bVar68 * auVar109._12_4_;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar120._16_4_ = (uint)bVar68 * auVar101._16_4_ | (uint)!bVar68 * auVar109._16_4_;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar120._20_4_ = (uint)bVar68 * auVar101._20_4_ | (uint)!bVar68 * auVar109._20_4_;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar120._24_4_ = (uint)bVar68 * auVar101._24_4_ | (uint)!bVar68 * auVar109._24_4_;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar120._28_4_ = (uint)bVar68 * auVar101._28_4_ | (uint)!bVar68 * auVar109._28_4_;
        auVar209._8_4_ = 0xff800000;
        auVar209._0_8_ = 0xff800000ff800000;
        auVar209._12_4_ = 0xff800000;
        auVar209._16_4_ = 0xff800000;
        auVar209._20_4_ = 0xff800000;
        auVar209._24_4_ = 0xff800000;
        auVar209._28_4_ = 0xff800000;
        auVar101 = vblendmps_avx512vl(auVar209,auVar42);
        bVar68 = (bool)((byte)uVar70 & 1);
        auVar122._0_4_ = (uint)bVar68 * auVar101._0_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar68 * auVar101._4_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar68 * auVar101._8_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar68 * auVar101._12_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar122._16_4_ = (uint)bVar68 * auVar101._16_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar122._20_4_ = (uint)bVar68 * auVar101._20_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar122._24_4_ = (uint)bVar68 * auVar101._24_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = SUB81(uVar70 >> 7,0);
        auVar122._28_4_ = (uint)bVar68 * auVar101._28_4_ | (uint)!bVar68 * -0x800000;
        auVar258._8_4_ = 0x7fffffff;
        auVar258._0_8_ = 0x7fffffff7fffffff;
        auVar258._12_4_ = 0x7fffffff;
        auVar258._16_4_ = 0x7fffffff;
        auVar258._20_4_ = 0x7fffffff;
        auVar258._24_4_ = 0x7fffffff;
        auVar258._28_4_ = 0x7fffffff;
        auVar101 = vandps_avx(auVar258,local_560);
        auVar101 = vmaxps_avx(local_3c0,auVar101);
        auVar30._8_4_ = 0x36000000;
        auVar30._0_8_ = 0x3600000036000000;
        auVar30._12_4_ = 0x36000000;
        auVar30._16_4_ = 0x36000000;
        auVar30._20_4_ = 0x36000000;
        auVar30._24_4_ = 0x36000000;
        auVar30._28_4_ = 0x36000000;
        auVar104 = vmulps_avx512vl(auVar101,auVar30);
        auVar101 = vandps_avx(auVar103,auVar258);
        uVar60 = vcmpps_avx512vl(auVar101,auVar104,1);
        uVar70 = uVar70 & uVar60;
        bVar56 = (byte)uVar70;
        if (bVar56 != 0) {
          uVar60 = vcmpps_avx512vl(auVar99,ZEXT1632(auVar79),2);
          auVar259._8_4_ = 0xff800000;
          auVar259._0_8_ = 0xff800000ff800000;
          auVar259._12_4_ = 0xff800000;
          auVar259._16_4_ = 0xff800000;
          auVar259._20_4_ = 0xff800000;
          auVar259._24_4_ = 0xff800000;
          auVar259._28_4_ = 0xff800000;
          auVar272._8_4_ = 0x7f800000;
          auVar272._0_8_ = 0x7f8000007f800000;
          auVar272._12_4_ = 0x7f800000;
          auVar272._16_4_ = 0x7f800000;
          auVar272._20_4_ = 0x7f800000;
          auVar272._24_4_ = 0x7f800000;
          auVar272._28_4_ = 0x7f800000;
          auVar99 = vblendmps_avx512vl(auVar272,auVar259);
          bVar61 = (byte)uVar60;
          uVar71 = (uint)(bVar61 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar104._0_4_;
          bVar68 = (bool)((byte)(uVar60 >> 1) & 1);
          uVar137 = (uint)bVar68 * auVar99._4_4_ | (uint)!bVar68 * auVar104._4_4_;
          bVar68 = (bool)((byte)(uVar60 >> 2) & 1);
          uVar138 = (uint)bVar68 * auVar99._8_4_ | (uint)!bVar68 * auVar104._8_4_;
          bVar68 = (bool)((byte)(uVar60 >> 3) & 1);
          uVar139 = (uint)bVar68 * auVar99._12_4_ | (uint)!bVar68 * auVar104._12_4_;
          bVar68 = (bool)((byte)(uVar60 >> 4) & 1);
          uVar140 = (uint)bVar68 * auVar99._16_4_ | (uint)!bVar68 * auVar104._16_4_;
          bVar68 = (bool)((byte)(uVar60 >> 5) & 1);
          uVar141 = (uint)bVar68 * auVar99._20_4_ | (uint)!bVar68 * auVar104._20_4_;
          bVar68 = (bool)((byte)(uVar60 >> 6) & 1);
          uVar142 = (uint)bVar68 * auVar99._24_4_ | (uint)!bVar68 * auVar104._24_4_;
          bVar68 = SUB81(uVar60 >> 7,0);
          uVar143 = (uint)bVar68 * auVar99._28_4_ | (uint)!bVar68 * auVar104._28_4_;
          auVar120._0_4_ = (bVar56 & 1) * uVar71 | !(bool)(bVar56 & 1) * auVar120._0_4_;
          bVar68 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar120._4_4_ = bVar68 * uVar137 | !bVar68 * auVar120._4_4_;
          bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar120._8_4_ = bVar68 * uVar138 | !bVar68 * auVar120._8_4_;
          bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar120._12_4_ = bVar68 * uVar139 | !bVar68 * auVar120._12_4_;
          bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar120._16_4_ = bVar68 * uVar140 | !bVar68 * auVar120._16_4_;
          bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar120._20_4_ = bVar68 * uVar141 | !bVar68 * auVar120._20_4_;
          bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar120._24_4_ = bVar68 * uVar142 | !bVar68 * auVar120._24_4_;
          bVar68 = SUB81(uVar70 >> 7,0);
          auVar120._28_4_ = bVar68 * uVar143 | !bVar68 * auVar120._28_4_;
          auVar99 = vblendmps_avx512vl(auVar259,auVar272);
          bVar68 = (bool)((byte)(uVar60 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar60 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar60 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
          bVar14 = SUB81(uVar60 >> 7,0);
          auVar122._0_4_ =
               (uint)(bVar56 & 1) *
               ((uint)(bVar61 & 1) * auVar99._0_4_ | !(bool)(bVar61 & 1) * uVar71) |
               !(bool)(bVar56 & 1) * auVar122._0_4_;
          bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar122._4_4_ =
               (uint)bVar8 * ((uint)bVar68 * auVar99._4_4_ | !bVar68 * uVar137) |
               !bVar8 * auVar122._4_4_;
          bVar68 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar122._8_4_ =
               (uint)bVar68 * ((uint)bVar9 * auVar99._8_4_ | !bVar9 * uVar138) |
               !bVar68 * auVar122._8_4_;
          bVar68 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar122._12_4_ =
               (uint)bVar68 * ((uint)bVar10 * auVar99._12_4_ | !bVar10 * uVar139) |
               !bVar68 * auVar122._12_4_;
          bVar68 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar122._16_4_ =
               (uint)bVar68 * ((uint)bVar11 * auVar99._16_4_ | !bVar11 * uVar140) |
               !bVar68 * auVar122._16_4_;
          bVar68 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar122._20_4_ =
               (uint)bVar68 * ((uint)bVar12 * auVar99._20_4_ | !bVar12 * uVar141) |
               !bVar68 * auVar122._20_4_;
          bVar68 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar122._24_4_ =
               (uint)bVar68 * ((uint)bVar13 * auVar99._24_4_ | !bVar13 * uVar142) |
               !bVar68 * auVar122._24_4_;
          bVar68 = SUB81(uVar70 >> 7,0);
          auVar122._28_4_ =
               (uint)bVar68 * ((uint)bVar14 * auVar99._28_4_ | !bVar14 * uVar143) |
               !bVar68 * auVar122._28_4_;
          bVar62 = (~bVar56 | bVar61) & bVar62;
        }
      }
      auVar271._8_4_ = 0x7fffffff;
      auVar271._0_8_ = 0x7fffffff7fffffff;
      auVar271._12_4_ = 0x7fffffff;
      auVar232._0_4_ = (float)local_540._0_4_ * auVar214._0_4_;
      auVar232._4_4_ = (float)local_540._4_4_ * auVar214._4_4_;
      auVar232._8_4_ = fStack_538 * auVar214._8_4_;
      auVar232._12_4_ = fStack_534 * auVar214._12_4_;
      auVar232._16_4_ = fStack_530 * auVar214._16_4_;
      auVar232._20_4_ = fStack_52c * auVar214._20_4_;
      auVar232._28_36_ = auVar214._28_36_;
      auVar232._24_4_ = fStack_528 * auVar214._24_4_;
      auVar78 = vfmadd231ps_fma(auVar232._0_32_,local_520,auVar100);
      auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_500,auVar107);
      _local_1c0 = _local_580;
      local_1a0 = vminps_avx(local_260,auVar120);
      auVar249._8_4_ = 0x7fffffff;
      auVar249._0_8_ = 0x7fffffff7fffffff;
      auVar249._12_4_ = 0x7fffffff;
      auVar249._16_4_ = 0x7fffffff;
      auVar249._20_4_ = 0x7fffffff;
      auVar249._24_4_ = 0x7fffffff;
      auVar249._28_4_ = 0x7fffffff;
      auVar99 = vandps_avx(ZEXT1632(auVar78),auVar249);
      _local_4e0 = vmaxps_avx(_local_580,auVar122);
      _local_280 = _local_4e0;
      auVar210._8_4_ = 0x3e99999a;
      auVar210._0_8_ = 0x3e99999a3e99999a;
      auVar210._12_4_ = 0x3e99999a;
      auVar210._16_4_ = 0x3e99999a;
      auVar210._20_4_ = 0x3e99999a;
      auVar210._24_4_ = 0x3e99999a;
      auVar210._28_4_ = 0x3e99999a;
      uVar15 = vcmpps_avx512vl(auVar99,auVar210,1);
      uVar16 = vcmpps_avx512vl(_local_580,local_1a0,2);
      bVar56 = (byte)uVar16 & bVar58;
      uVar17 = vcmpps_avx512vl(_local_4e0,local_260,2);
      if ((bVar58 & ((byte)uVar17 | (byte)uVar16)) == 0) {
        auVar224 = ZEXT3264(_DAT_02020f20);
        auVar275 = ZEXT3264(local_700);
        auVar214 = ZEXT3264(local_620);
        auVar232 = ZEXT3264(local_720);
      }
      else {
        auVar44._4_4_ = (float)local_540._4_4_ * auVar264._4_4_;
        auVar44._0_4_ = (float)local_540._0_4_ * auVar264._0_4_;
        auVar44._8_4_ = fStack_538 * auVar264._8_4_;
        auVar44._12_4_ = fStack_534 * auVar264._12_4_;
        auVar44._16_4_ = fStack_530 * auVar264._16_4_;
        auVar44._20_4_ = fStack_52c * auVar264._20_4_;
        auVar44._24_4_ = fStack_528 * auVar264._24_4_;
        auVar44._28_4_ = 0x3e99999a;
        auVar78 = vfmadd213ps_fma(auVar108,local_520,auVar44);
        auVar78 = vfmadd213ps_fma(auVar106,local_500,ZEXT1632(auVar78));
        auVar99 = vandps_avx(ZEXT1632(auVar78),auVar249);
        uVar16 = vcmpps_avx512vl(auVar99,auVar210,1);
        bVar61 = (byte)uVar16 | ~bVar62;
        auVar162._8_4_ = 2;
        auVar162._0_8_ = 0x200000002;
        auVar162._12_4_ = 2;
        auVar162._16_4_ = 2;
        auVar162._20_4_ = 2;
        auVar162._24_4_ = 2;
        auVar162._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar99 = vpblendmd_avx512vl(auVar162,auVar31);
        local_240._0_4_ = (uint)(bVar61 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
        bVar68 = (bool)(bVar61 >> 1 & 1);
        local_240._4_4_ = (uint)bVar68 * auVar99._4_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar61 >> 2 & 1);
        local_240._8_4_ = (uint)bVar68 * auVar99._8_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar61 >> 3 & 1);
        local_240._12_4_ = (uint)bVar68 * auVar99._12_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar61 >> 4 & 1);
        local_240._16_4_ = (uint)bVar68 * auVar99._16_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar61 >> 5 & 1);
        local_240._20_4_ = (uint)bVar68 * auVar99._20_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar61 >> 6 & 1);
        local_240._24_4_ = (uint)bVar68 * auVar99._24_4_ | (uint)!bVar68 * 2;
        local_240._28_4_ = (uint)(bVar61 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2;
        local_3e0 = vpbroadcastd_avx512vl();
        uVar16 = vpcmpd_avx512vl(local_3e0,local_240,5);
        bVar61 = (byte)uVar16 & bVar56;
        if (bVar61 != 0) {
          auVar79 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar78 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar80 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar81 = vminps_avx(auVar79,auVar80);
          auVar79 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar80 = vmaxps_avx(auVar78,auVar79);
          auVar78 = vandps_avx(auVar271,auVar81);
          auVar79 = vandps_avx(auVar271,auVar80);
          auVar78 = vmaxps_avx(auVar78,auVar79);
          auVar79 = vmovshdup_avx(auVar78);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          fVar241 = auVar78._0_4_ * 1.9073486e-06;
          local_690 = vshufps_avx(auVar80,auVar80,0xff);
          local_4c0 = (float)local_580._0_4_ + (float)local_780._0_4_;
          fStack_4bc = (float)local_580._4_4_ + (float)local_780._4_4_;
          fStack_4b8 = fStack_578 + fStack_778;
          fStack_4b4 = fStack_574 + fStack_774;
          fStack_4b0 = fStack_570 + fStack_770;
          fStack_4ac = fStack_56c + fStack_76c;
          fStack_4a8 = fStack_568 + fStack_768;
          fStack_4a4 = fStack_564 + fStack_764;
          do {
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar99 = vblendmps_avx512vl(auVar163,_local_580);
            auVar134._0_4_ =
                 (uint)(bVar61 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar68 * auVar99._4_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar68 * auVar99._8_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar68 * auVar99._12_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar68 * auVar99._16_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar61 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar68 * auVar99._20_4_ | (uint)!bVar68 * 0x7f800000;
            auVar134._24_4_ =
                 (uint)(bVar61 >> 6) * auVar99._24_4_ | (uint)!(bool)(bVar61 >> 6) * 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar99 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar99 = vminps_avx(auVar134,auVar99);
            auVar100 = vshufpd_avx(auVar99,auVar99,5);
            auVar99 = vminps_avx(auVar99,auVar100);
            auVar100 = vpermpd_avx2(auVar99,0x4e);
            auVar99 = vminps_avx(auVar99,auVar100);
            uVar16 = vcmpps_avx512vl(auVar134,auVar99,0);
            bVar55 = (byte)uVar16 & bVar61;
            bVar64 = bVar61;
            if (bVar55 != 0) {
              bVar64 = bVar55;
            }
            iVar18 = 0;
            for (uVar71 = (uint)bVar64; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            bVar64 = '\x01' << ((byte)iVar18 & 0x1f);
            uVar71 = *(uint *)(local_480 + (uint)(iVar18 << 2));
            fVar250 = *(float *)(local_1c0 + (uint)(iVar18 << 2));
            fVar251 = auVar75._0_4_;
            if ((float)local_740._0_4_ < 0.0) {
              fVar251 = sqrtf((float)local_740._0_4_);
            }
            auVar214 = ZEXT464(uVar71);
            bVar55 = ~bVar64;
            lVar66 = 5;
            do {
              auVar149._4_4_ = fVar250;
              auVar149._0_4_ = fVar250;
              auVar149._8_4_ = fVar250;
              auVar149._12_4_ = fVar250;
              auVar79 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_730);
              fVar260 = auVar214._0_4_;
              fVar252 = 1.0 - fVar260;
              auVar194._0_4_ = local_5e0._0_4_ * fVar260;
              auVar194._4_4_ = local_5e0._4_4_ * fVar260;
              auVar194._8_4_ = local_5e0._8_4_ * fVar260;
              auVar194._12_4_ = local_5e0._12_4_ * fVar260;
              local_560._0_16_ = ZEXT416((uint)fVar252);
              auVar218._4_4_ = fVar252;
              auVar218._0_4_ = fVar252;
              auVar218._8_4_ = fVar252;
              auVar218._12_4_ = fVar252;
              auVar78 = vfmadd231ps_fma(auVar194,auVar218,local_5a0._0_16_);
              auVar228._0_4_ = local_5c0._0_4_ * fVar260;
              auVar228._4_4_ = local_5c0._4_4_ * fVar260;
              auVar228._8_4_ = local_5c0._8_4_ * fVar260;
              auVar228._12_4_ = local_5c0._12_4_ * fVar260;
              auVar80 = vfmadd231ps_fma(auVar228,auVar218,local_5e0._0_16_);
              auVar237._0_4_ = fVar260 * (float)local_600._0_4_;
              auVar237._4_4_ = fVar260 * (float)local_600._4_4_;
              auVar237._8_4_ = fVar260 * fStack_5f8;
              auVar237._12_4_ = fVar260 * fStack_5f4;
              auVar81 = vfmadd231ps_fma(auVar237,auVar218,local_5c0._0_16_);
              auVar246._0_4_ = fVar260 * auVar80._0_4_;
              auVar246._4_4_ = fVar260 * auVar80._4_4_;
              auVar246._8_4_ = fVar260 * auVar80._8_4_;
              auVar246._12_4_ = fVar260 * auVar80._12_4_;
              auVar78 = vfmadd231ps_fma(auVar246,auVar218,auVar78);
              auVar195._0_4_ = fVar260 * auVar81._0_4_;
              auVar195._4_4_ = fVar260 * auVar81._4_4_;
              auVar195._8_4_ = fVar260 * auVar81._8_4_;
              auVar195._12_4_ = fVar260 * auVar81._12_4_;
              auVar80 = vfmadd231ps_fma(auVar195,auVar218,auVar80);
              auVar229._0_4_ = fVar260 * auVar80._0_4_;
              auVar229._4_4_ = fVar260 * auVar80._4_4_;
              auVar229._8_4_ = fVar260 * auVar80._8_4_;
              auVar229._12_4_ = fVar260 * auVar80._12_4_;
              auVar81 = vfmadd231ps_fma(auVar229,auVar78,auVar218);
              auVar78 = vsubps_avx(auVar80,auVar78);
              auVar22._8_4_ = 0x40400000;
              auVar22._0_8_ = 0x4040000040400000;
              auVar22._12_4_ = 0x40400000;
              auVar80 = vmulps_avx512vl(auVar78,auVar22);
              local_6e0._0_16_ = auVar81;
              auVar78 = vsubps_avx(auVar79,auVar81);
              _local_760 = auVar78;
              auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
              fVar252 = auVar78._0_4_;
              if (fVar252 < 0.0) {
                auVar274._0_4_ = sqrtf(fVar252);
                auVar274._4_60_ = extraout_var;
                auVar79 = auVar274._0_16_;
              }
              else {
                auVar79 = vsqrtss_avx(auVar78,auVar78);
              }
              local_640 = vdpps_avx(auVar80,auVar80,0x7f);
              fVar253 = local_640._0_4_;
              auVar196._4_12_ = ZEXT812(0) << 0x20;
              auVar196._0_4_ = fVar253;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar196);
              fVar254 = auVar81._0_4_;
              local_650 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar196);
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_640,auVar23);
              auVar81 = vfnmadd213ss_fma(local_650,local_640,ZEXT416(0x40000000));
              uVar71 = auVar79._0_4_;
              if (fVar253 < auVar77._0_4_) {
                auVar275._0_4_ = sqrtf(fVar253);
                auVar275._4_60_ = extraout_var_00;
                auVar79 = ZEXT416(uVar71);
                auVar77 = auVar275._0_16_;
              }
              else {
                auVar77 = vsqrtss_avx512f(local_640,local_640);
              }
              fVar253 = fVar254 * 1.5 + fVar253 * -0.5 * fVar254 * fVar254 * fVar254;
              auVar150._0_4_ = auVar80._0_4_ * fVar253;
              auVar150._4_4_ = auVar80._4_4_ * fVar253;
              auVar150._8_4_ = auVar80._8_4_ * fVar253;
              auVar150._12_4_ = auVar80._12_4_ * fVar253;
              auVar86 = vdpps_avx(_local_760,auVar150,0x7f);
              auVar82 = vaddss_avx512f(auVar79,ZEXT416(0x3f800000));
              auVar151._0_4_ = auVar86._0_4_ * auVar86._0_4_;
              auVar151._4_4_ = auVar86._4_4_ * auVar86._4_4_;
              auVar151._8_4_ = auVar86._8_4_ * auVar86._8_4_;
              auVar151._12_4_ = auVar86._12_4_ * auVar86._12_4_;
              auVar78 = vsubps_avx(auVar78,auVar151);
              fVar254 = auVar78._0_4_;
              auVar173._4_12_ = ZEXT812(0) << 0x20;
              auVar173._0_4_ = fVar254;
              auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
              auVar84 = vmulss_avx512f(auVar83,ZEXT416(0x3fc00000));
              uVar69 = fVar254 == 0.0;
              uVar67 = fVar254 < 0.0;
              if ((bool)uVar67) {
                local_670 = fVar253;
                fStack_66c = fVar253;
                fStack_668 = fVar253;
                fStack_664 = fVar253;
                local_660 = auVar83;
                fVar255 = sqrtf(fVar254);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar79 = ZEXT416(uVar71);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar83 = local_660;
                fVar253 = local_670;
                fVar263 = fStack_66c;
                fVar265 = fStack_668;
                fVar266 = fStack_664;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                fVar255 = auVar78._0_4_;
                fVar263 = fVar253;
                fVar265 = fVar253;
                fVar266 = fVar253;
              }
              auVar271._8_4_ = 0x7fffffff;
              auVar271._0_8_ = 0x7fffffff7fffffff;
              auVar271._12_4_ = 0x7fffffff;
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar214._0_16_,
                                        local_560._0_16_);
              fVar267 = auVar78._0_4_ * 6.0;
              fVar268 = fVar260 * 6.0;
              auVar197._0_4_ = fVar268 * (float)local_600._0_4_;
              auVar197._4_4_ = fVar268 * (float)local_600._4_4_;
              auVar197._8_4_ = fVar268 * fStack_5f8;
              auVar197._12_4_ = fVar268 * fStack_5f4;
              auVar174._4_4_ = fVar267;
              auVar174._0_4_ = fVar267;
              auVar174._8_4_ = fVar267;
              auVar174._12_4_ = fVar267;
              auVar78 = vfmadd132ps_fma(auVar174,auVar197,local_5c0._0_16_);
              auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_560._0_16_,
                                        auVar214._0_16_);
              fVar267 = auVar87._0_4_ * 6.0;
              auVar198._4_4_ = fVar267;
              auVar198._0_4_ = fVar267;
              auVar198._8_4_ = fVar267;
              auVar198._12_4_ = fVar267;
              auVar78 = vfmadd132ps_fma(auVar198,auVar78,local_5e0._0_16_);
              fVar267 = local_560._0_4_ * 6.0;
              auVar175._4_4_ = fVar267;
              auVar175._0_4_ = fVar267;
              auVar175._8_4_ = fVar267;
              auVar175._12_4_ = fVar267;
              auVar78 = vfmadd132ps_fma(auVar175,auVar78,local_5a0._0_16_);
              auVar199._0_4_ = auVar78._0_4_ * (float)local_640._0_4_;
              auVar199._4_4_ = auVar78._4_4_ * (float)local_640._0_4_;
              auVar199._8_4_ = auVar78._8_4_ * (float)local_640._0_4_;
              auVar199._12_4_ = auVar78._12_4_ * (float)local_640._0_4_;
              auVar78 = vdpps_avx(auVar80,auVar78,0x7f);
              fVar267 = auVar78._0_4_;
              auVar176._0_4_ = auVar80._0_4_ * fVar267;
              auVar176._4_4_ = auVar80._4_4_ * fVar267;
              auVar176._8_4_ = auVar80._8_4_ * fVar267;
              auVar176._12_4_ = auVar80._12_4_ * fVar267;
              auVar78 = vsubps_avx(auVar199,auVar176);
              fVar267 = auVar81._0_4_ * (float)local_650._0_4_;
              auVar87 = vmaxss_avx(ZEXT416((uint)fVar241),
                                   ZEXT416((uint)(fVar250 * fVar251 * 1.9073486e-06)));
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar85 = vxorps_avx512vl(auVar80,auVar24);
              auVar200._0_4_ = fVar253 * auVar78._0_4_ * fVar267;
              auVar200._4_4_ = fVar263 * auVar78._4_4_ * fVar267;
              auVar200._8_4_ = fVar265 * auVar78._8_4_ * fVar267;
              auVar200._12_4_ = fVar266 * auVar78._12_4_ * fVar267;
              auVar274 = ZEXT1664(auVar150);
              auVar78 = vdpps_avx(auVar85,auVar150,0x7f);
              auVar77 = vdivss_avx512f(ZEXT416((uint)fVar241),auVar77);
              auVar81 = vfmadd213ss_fma(auVar79,ZEXT416((uint)fVar241),auVar87);
              auVar79 = vdpps_avx(_local_760,auVar200,0x7f);
              vfmadd213ss_avx512f(auVar82,auVar77,auVar81);
              fVar253 = auVar78._0_4_ + auVar79._0_4_;
              auVar78 = vdpps_avx(local_730,auVar150,0x7f);
              auVar79 = vdpps_avx(_local_760,auVar85,0x7f);
              auVar81 = vmulss_avx512f(auVar83,ZEXT416((uint)(fVar254 * -0.5)));
              auVar77 = vmulss_avx512f(auVar83,auVar83);
              auVar77 = vaddss_avx512f(auVar84,ZEXT416((uint)(auVar81._0_4_ * auVar77._0_4_)));
              auVar81 = vdpps_avx(_local_760,local_730,0x7f);
              auVar83 = vfnmadd231ss_avx512f(auVar79,auVar86,ZEXT416((uint)fVar253));
              auVar82 = vfnmadd231ss_avx512f(auVar81,auVar86,auVar78);
              auVar79 = vpermilps_avx(local_6e0._0_16_,0xff);
              fVar255 = fVar255 - auVar79._0_4_;
              auVar79 = vshufps_avx(auVar80,auVar80,0xff);
              auVar81 = vfmsub213ss_fma(auVar83,auVar77,auVar79);
              fVar254 = auVar82._0_4_ * auVar77._0_4_;
              auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar81._0_4_)),
                                        ZEXT416((uint)fVar253),ZEXT416((uint)fVar254));
              fVar263 = auVar77._0_4_;
              auVar247._0_4_ = fVar254 / fVar263;
              auVar247._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar219._0_4_ = auVar81._0_4_ / fVar263;
              auVar219._4_12_ = auVar81._4_12_;
              auVar81 = vmulss_avx512f(auVar86,auVar247);
              auVar77 = vmulss_avx512f(auVar86,auVar219);
              fVar260 = fVar260 - (auVar81._0_4_ - fVar255 * (auVar78._0_4_ / fVar263));
              auVar214 = ZEXT464((uint)fVar260);
              fVar250 = fVar250 - (fVar255 * (fVar253 / fVar263) - auVar77._0_4_);
              auVar78 = vandps_avx512vl(auVar86,auVar271);
              auVar78 = vucomiss_avx512f(auVar78);
              bVar68 = true;
              if (!(bool)uVar67 && !(bool)uVar69) {
                auVar78 = vaddss_avx512f(auVar87,auVar78);
                auVar81 = vfmadd231ss_fma(auVar78,local_690,ZEXT416(0x36000000));
                auVar78 = vandps_avx(auVar271,ZEXT416((uint)fVar255));
                if (auVar78._0_4_ < auVar81._0_4_) {
                  fVar250 = fVar250 + (float)local_680._0_4_;
                  if ((((fVar144 <= fVar250) &&
                       (fVar253 = *(float *)(ray + k * 4 + 0x100), fVar250 <= fVar253)) &&
                      (0.0 <= fVar260)) && (fVar260 <= 1.0)) {
                    auVar46._12_4_ = 0;
                    auVar46._0_12_ = ZEXT812(0);
                    auVar78 = vrsqrt14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar252));
                    fVar254 = auVar78._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar59].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar64 = true;
                      }
                      else {
                        fVar252 = fVar254 * 1.5 + fVar252 * -0.5 * fVar254 * fVar254 * fVar254;
                        auVar177._0_4_ = local_760._0_4_ * fVar252;
                        auVar177._4_4_ = local_760._4_4_ * fVar252;
                        auVar177._8_4_ = local_760._8_4_ * fVar252;
                        auVar177._12_4_ = local_760._12_4_ * fVar252;
                        auVar81 = vfmadd213ps_fma(auVar79,auVar177,auVar80);
                        auVar78 = vshufps_avx(auVar177,auVar177,0xc9);
                        auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar178._0_4_ = auVar177._0_4_ * auVar79._0_4_;
                        auVar178._4_4_ = auVar177._4_4_ * auVar79._4_4_;
                        auVar178._8_4_ = auVar177._8_4_ * auVar79._8_4_;
                        auVar178._12_4_ = auVar177._12_4_ * auVar79._12_4_;
                        auVar80 = vfmsub231ps_fma(auVar178,auVar80,auVar78);
                        auVar78 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar79 = vshufps_avx(auVar81,auVar81,0xc9);
                        auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                        auVar152._0_4_ = auVar81._0_4_ * auVar80._0_4_;
                        auVar152._4_4_ = auVar81._4_4_ * auVar80._4_4_;
                        auVar152._8_4_ = auVar81._8_4_ * auVar80._8_4_;
                        auVar152._12_4_ = auVar81._12_4_ * auVar80._12_4_;
                        auVar78 = vfmsub231ps_fma(auVar152,auVar78,auVar79);
                        auVar211._8_4_ = 1;
                        auVar211._0_8_ = 0x100000001;
                        auVar211._12_4_ = 1;
                        auVar211._16_4_ = 1;
                        auVar211._20_4_ = 1;
                        auVar211._24_4_ = 1;
                        auVar211._28_4_ = 1;
                        auVar99 = vpermps_avx2(auVar211,ZEXT1632(auVar78));
                        auVar221._8_4_ = 2;
                        auVar221._0_8_ = 0x200000002;
                        auVar221._12_4_ = 2;
                        auVar221._16_4_ = 2;
                        auVar221._20_4_ = 2;
                        auVar221._24_4_ = 2;
                        auVar221._28_4_ = 2;
                        local_380 = vpermps_avx2(auVar221,ZEXT1632(auVar78));
                        local_360 = auVar78._0_4_;
                        local_3a0[0] = (RTCHitN)auVar99[0];
                        local_3a0[1] = (RTCHitN)auVar99[1];
                        local_3a0[2] = (RTCHitN)auVar99[2];
                        local_3a0[3] = (RTCHitN)auVar99[3];
                        local_3a0[4] = (RTCHitN)auVar99[4];
                        local_3a0[5] = (RTCHitN)auVar99[5];
                        local_3a0[6] = (RTCHitN)auVar99[6];
                        local_3a0[7] = (RTCHitN)auVar99[7];
                        local_3a0[8] = (RTCHitN)auVar99[8];
                        local_3a0[9] = (RTCHitN)auVar99[9];
                        local_3a0[10] = (RTCHitN)auVar99[10];
                        local_3a0[0xb] = (RTCHitN)auVar99[0xb];
                        local_3a0[0xc] = (RTCHitN)auVar99[0xc];
                        local_3a0[0xd] = (RTCHitN)auVar99[0xd];
                        local_3a0[0xe] = (RTCHitN)auVar99[0xe];
                        local_3a0[0xf] = (RTCHitN)auVar99[0xf];
                        local_3a0[0x10] = (RTCHitN)auVar99[0x10];
                        local_3a0[0x11] = (RTCHitN)auVar99[0x11];
                        local_3a0[0x12] = (RTCHitN)auVar99[0x12];
                        local_3a0[0x13] = (RTCHitN)auVar99[0x13];
                        local_3a0[0x14] = (RTCHitN)auVar99[0x14];
                        local_3a0[0x15] = (RTCHitN)auVar99[0x15];
                        local_3a0[0x16] = (RTCHitN)auVar99[0x16];
                        local_3a0[0x17] = (RTCHitN)auVar99[0x17];
                        local_3a0[0x18] = (RTCHitN)auVar99[0x18];
                        local_3a0[0x19] = (RTCHitN)auVar99[0x19];
                        local_3a0[0x1a] = (RTCHitN)auVar99[0x1a];
                        local_3a0[0x1b] = (RTCHitN)auVar99[0x1b];
                        local_3a0[0x1c] = (RTCHitN)auVar99[0x1c];
                        local_3a0[0x1d] = (RTCHitN)auVar99[0x1d];
                        local_3a0[0x1e] = (RTCHitN)auVar99[0x1e];
                        local_3a0[0x1f] = (RTCHitN)auVar99[0x1f];
                        uStack_35c = local_360;
                        uStack_358 = local_360;
                        uStack_354 = local_360;
                        uStack_350 = local_360;
                        uStack_34c = local_360;
                        uStack_348 = local_360;
                        uStack_344 = local_360;
                        local_340 = fVar260;
                        fStack_33c = fVar260;
                        fStack_338 = fVar260;
                        fStack_334 = fVar260;
                        fStack_330 = fVar260;
                        fStack_32c = fVar260;
                        fStack_328 = fVar260;
                        fStack_324 = fVar260;
                        local_320 = ZEXT432(0) << 0x20;
                        local_300 = local_400._0_8_;
                        uStack_2f8 = local_400._8_8_;
                        uStack_2f0 = local_400._16_8_;
                        uStack_2e8 = local_400._24_8_;
                        local_2e0 = local_420;
                        vpcmpeqd_avx2(local_420,local_420);
                        local_2c0 = context->user->instID[0];
                        uStack_2bc = local_2c0;
                        uStack_2b8 = local_2c0;
                        uStack_2b4 = local_2c0;
                        uStack_2b0 = local_2c0;
                        uStack_2ac = local_2c0;
                        uStack_2a8 = local_2c0;
                        uStack_2a4 = local_2c0;
                        local_2a0 = context->user->instPrimID[0];
                        uStack_29c = local_2a0;
                        uStack_298 = local_2a0;
                        uStack_294 = local_2a0;
                        uStack_290 = local_2a0;
                        uStack_28c = local_2a0;
                        uStack_288 = local_2a0;
                        uStack_284 = local_2a0;
                        *(float *)(ray + k * 4 + 0x100) = fVar250;
                        local_6c0 = local_440._0_8_;
                        uStack_6b8 = local_440._8_8_;
                        uStack_6b0 = local_440._16_8_;
                        uStack_6a8 = local_440._24_8_;
                        local_7b0.valid = (int *)&local_6c0;
                        local_7b0.geometryUserPtr = pGVar3->userPtr;
                        local_7b0.context = context->user;
                        local_7b0.hit = local_3a0;
                        local_7b0.N = 8;
                        local_7b0.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar274 = ZEXT1664(auVar150);
                          (*pGVar3->occlusionFilterN)(&local_7b0);
                          auVar214 = ZEXT1664(ZEXT416((uint)fVar260));
                          auVar271._8_4_ = 0x7fffffff;
                          auVar271._0_8_ = 0x7fffffff7fffffff;
                          auVar271._12_4_ = 0x7fffffff;
                        }
                        auVar48._8_8_ = uStack_6b8;
                        auVar48._0_8_ = local_6c0;
                        auVar48._16_8_ = uStack_6b0;
                        auVar48._24_8_ = uStack_6a8;
                        if (auVar48 == (undefined1  [32])0x0) {
                          bVar64 = false;
                        }
                        else {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar274 = ZEXT1664(auVar274._0_16_);
                            (*p_Var7)(&local_7b0);
                            auVar214 = ZEXT1664(ZEXT416((uint)fVar260));
                            auVar271._8_4_ = 0x7fffffff;
                            auVar271._0_8_ = 0x7fffffff7fffffff;
                            auVar271._12_4_ = 0x7fffffff;
                          }
                          auVar49._8_8_ = uStack_6b8;
                          auVar49._0_8_ = local_6c0;
                          auVar49._16_8_ = uStack_6b0;
                          auVar49._24_8_ = uStack_6a8;
                          uVar70 = vptestmd_avx512vl(auVar49,auVar49);
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar68 = (bool)((byte)uVar70 & 1);
                          bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar10 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar11 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar14 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_7b0.ray + 0x100) =
                               (uint)bVar68 * auVar99._0_4_ |
                               (uint)!bVar68 * *(int *)(local_7b0.ray + 0x100);
                          *(uint *)(local_7b0.ray + 0x104) =
                               (uint)bVar8 * auVar99._4_4_ |
                               (uint)!bVar8 * *(int *)(local_7b0.ray + 0x104);
                          *(uint *)(local_7b0.ray + 0x108) =
                               (uint)bVar9 * auVar99._8_4_ |
                               (uint)!bVar9 * *(int *)(local_7b0.ray + 0x108);
                          *(uint *)(local_7b0.ray + 0x10c) =
                               (uint)bVar10 * auVar99._12_4_ |
                               (uint)!bVar10 * *(int *)(local_7b0.ray + 0x10c);
                          *(uint *)(local_7b0.ray + 0x110) =
                               (uint)bVar11 * auVar99._16_4_ |
                               (uint)!bVar11 * *(int *)(local_7b0.ray + 0x110);
                          *(uint *)(local_7b0.ray + 0x114) =
                               (uint)bVar12 * auVar99._20_4_ |
                               (uint)!bVar12 * *(int *)(local_7b0.ray + 0x114);
                          *(uint *)(local_7b0.ray + 0x118) =
                               (uint)bVar13 * auVar99._24_4_ |
                               (uint)!bVar13 * *(int *)(local_7b0.ray + 0x118);
                          *(uint *)(local_7b0.ray + 0x11c) =
                               (uint)bVar14 * auVar99._28_4_ |
                               (uint)!bVar14 * *(int *)(local_7b0.ray + 0x11c);
                          bVar64 = auVar49 != (undefined1  [32])0x0;
                        }
                        if ((bool)bVar64 == false) {
                          *(float *)(ray + k * 4 + 0x100) = fVar253;
                        }
                      }
                      bVar68 = false;
                      goto LAB_01c03a2b;
                    }
                  }
                  bVar68 = false;
                  bVar64 = 0;
                }
              }
LAB_01c03a2b:
              if (!bVar68) goto LAB_01c03e04;
              lVar66 = lVar66 + -1;
            } while (lVar66 != 0);
            bVar64 = 0;
LAB_01c03e04:
            bVar63 = bVar63 | bVar64 & 1;
            auVar52._4_4_ = fStack_4bc;
            auVar52._0_4_ = local_4c0;
            auVar52._8_4_ = fStack_4b8;
            auVar52._12_4_ = fStack_4b4;
            auVar52._16_4_ = fStack_4b0;
            auVar52._20_4_ = fStack_4ac;
            auVar52._24_4_ = fStack_4a8;
            auVar52._28_4_ = fStack_4a4;
            uVar240 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar32._4_4_ = uVar240;
            auVar32._0_4_ = uVar240;
            auVar32._8_4_ = uVar240;
            auVar32._12_4_ = uVar240;
            auVar32._16_4_ = uVar240;
            auVar32._20_4_ = uVar240;
            auVar32._24_4_ = uVar240;
            auVar32._28_4_ = uVar240;
            uVar16 = vcmpps_avx512vl(auVar52,auVar32,2);
            bVar61 = bVar55 & bVar61 & (byte)uVar16;
          } while (bVar61 != 0);
        }
        auVar164._0_4_ = (float)local_780._0_4_ + (float)local_4e0._0_4_;
        auVar164._4_4_ = (float)local_780._4_4_ + (float)local_4e0._4_4_;
        auVar164._8_4_ = fStack_778 + fStack_4d8;
        auVar164._12_4_ = fStack_774 + fStack_4d4;
        auVar164._16_4_ = fStack_770 + fStack_4d0;
        auVar164._20_4_ = fStack_76c + fStack_4cc;
        auVar164._24_4_ = fStack_768 + fStack_4c8;
        auVar164._28_4_ = fStack_764 + fStack_4c4;
        uVar240 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar33._4_4_ = uVar240;
        auVar33._0_4_ = uVar240;
        auVar33._8_4_ = uVar240;
        auVar33._12_4_ = uVar240;
        auVar33._16_4_ = uVar240;
        auVar33._20_4_ = uVar240;
        auVar33._24_4_ = uVar240;
        auVar33._28_4_ = uVar240;
        uVar16 = vcmpps_avx512vl(auVar164,auVar33,2);
        bVar62 = (byte)uVar15 | ~bVar62;
        bVar58 = (byte)uVar17 & bVar58 & (byte)uVar16;
        auVar165._8_4_ = 2;
        auVar165._0_8_ = 0x200000002;
        auVar165._12_4_ = 2;
        auVar165._16_4_ = 2;
        auVar165._20_4_ = 2;
        auVar165._24_4_ = 2;
        auVar165._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar99 = vpblendmd_avx512vl(auVar165,auVar34);
        local_4e0._0_4_ = (uint)(bVar62 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
        bVar68 = (bool)(bVar62 >> 1 & 1);
        local_4e0._4_4_ = (uint)bVar68 * auVar99._4_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar62 >> 2 & 1);
        fStack_4d8 = (float)((uint)bVar68 * auVar99._8_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar62 >> 3 & 1);
        fStack_4d4 = (float)((uint)bVar68 * auVar99._12_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar62 >> 4 & 1);
        fStack_4d0 = (float)((uint)bVar68 * auVar99._16_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar62 >> 5 & 1);
        fStack_4cc = (float)((uint)bVar68 * auVar99._20_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar62 >> 6 & 1);
        fStack_4c8 = (float)((uint)bVar68 * auVar99._24_4_ | (uint)!bVar68 * 2);
        fStack_4c4 = (float)((uint)(bVar62 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2);
        uVar15 = vpcmpd_avx512vl(_local_4e0,local_3e0,2);
        bVar62 = (byte)uVar15 & bVar58;
        if (bVar62 == 0) {
          auVar275 = ZEXT3264(local_700);
          auVar232 = ZEXT3264(local_720);
          fVar241 = (float)local_780._0_4_;
          fVar250 = (float)local_780._4_4_;
          fVar251 = fStack_778;
          fVar252 = fStack_774;
          fVar260 = fStack_770;
          fVar253 = fStack_76c;
          fVar254 = fStack_768;
          fVar255 = fStack_764;
        }
        else {
          auVar79 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar78 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar80 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar81 = vminps_avx(auVar79,auVar80);
          auVar79 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar80 = vmaxps_avx(auVar78,auVar79);
          auVar78 = vandps_avx(auVar271,auVar81);
          auVar79 = vandps_avx(auVar271,auVar80);
          auVar78 = vmaxps_avx(auVar78,auVar79);
          auVar79 = vmovshdup_avx(auVar78);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          fVar263 = auVar78._0_4_ * 1.9073486e-06;
          local_690 = vshufps_avx(auVar80,auVar80,0xff);
          _local_580 = _local_280;
          local_4c0 = (float)local_780._0_4_ + (float)local_280._0_4_;
          fStack_4bc = (float)local_780._4_4_ + (float)local_280._4_4_;
          fStack_4b8 = fStack_778 + fStack_278;
          fStack_4b4 = fStack_774 + fStack_274;
          fStack_4b0 = fStack_770 + fStack_270;
          fStack_4ac = fStack_76c + fStack_26c;
          fStack_4a8 = fStack_768 + fStack_268;
          fStack_4a4 = fStack_764 + fStack_264;
          do {
            auVar166._8_4_ = 0x7f800000;
            auVar166._0_8_ = 0x7f8000007f800000;
            auVar166._12_4_ = 0x7f800000;
            auVar166._16_4_ = 0x7f800000;
            auVar166._20_4_ = 0x7f800000;
            auVar166._24_4_ = 0x7f800000;
            auVar166._28_4_ = 0x7f800000;
            auVar99 = vblendmps_avx512vl(auVar166,_local_580);
            auVar135._0_4_ =
                 (uint)(bVar62 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
            bVar68 = (bool)(bVar62 >> 1 & 1);
            auVar135._4_4_ = (uint)bVar68 * auVar99._4_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar62 >> 2 & 1);
            auVar135._8_4_ = (uint)bVar68 * auVar99._8_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar62 >> 3 & 1);
            auVar135._12_4_ = (uint)bVar68 * auVar99._12_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar62 >> 4 & 1);
            auVar135._16_4_ = (uint)bVar68 * auVar99._16_4_ | (uint)!bVar68 * 0x7f800000;
            bVar68 = (bool)(bVar62 >> 5 & 1);
            auVar135._20_4_ = (uint)bVar68 * auVar99._20_4_ | (uint)!bVar68 * 0x7f800000;
            auVar135._24_4_ =
                 (uint)(bVar62 >> 6) * auVar99._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar99 = vshufps_avx(auVar135,auVar135,0xb1);
            auVar99 = vminps_avx(auVar135,auVar99);
            auVar100 = vshufpd_avx(auVar99,auVar99,5);
            auVar99 = vminps_avx(auVar99,auVar100);
            auVar100 = vpermpd_avx2(auVar99,0x4e);
            auVar99 = vminps_avx(auVar99,auVar100);
            uVar15 = vcmpps_avx512vl(auVar135,auVar99,0);
            bVar64 = (byte)uVar15 & bVar62;
            bVar61 = bVar62;
            if (bVar64 != 0) {
              bVar61 = bVar64;
            }
            iVar18 = 0;
            for (uVar71 = (uint)bVar61; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            bVar61 = '\x01' << ((byte)iVar18 & 0x1f);
            fVar265 = *(float *)(local_4a0 + (uint)(iVar18 << 2));
            fVar266 = *(float *)(local_260 + (uint)(iVar18 << 2));
            fVar267 = auVar76._0_4_;
            if ((float)local_740._0_4_ < 0.0) {
              fVar267 = sqrtf((float)local_740._0_4_);
            }
            bVar64 = ~bVar61;
            lVar66 = 5;
            do {
              auVar153._4_4_ = fVar266;
              auVar153._0_4_ = fVar266;
              auVar153._8_4_ = fVar266;
              auVar153._12_4_ = fVar266;
              auVar79 = vfmadd132ps_fma(auVar153,ZEXT816(0) << 0x40,local_730);
              fVar241 = 1.0 - fVar265;
              auVar201._0_4_ = local_5e0._0_4_ * fVar265;
              auVar201._4_4_ = local_5e0._4_4_ * fVar265;
              auVar201._8_4_ = local_5e0._8_4_ * fVar265;
              auVar201._12_4_ = local_5e0._12_4_ * fVar265;
              local_560._0_16_ = ZEXT416((uint)fVar241);
              auVar220._4_4_ = fVar241;
              auVar220._0_4_ = fVar241;
              auVar220._8_4_ = fVar241;
              auVar220._12_4_ = fVar241;
              auVar78 = vfmadd231ps_fma(auVar201,auVar220,local_5a0._0_16_);
              auVar230._0_4_ = local_5c0._0_4_ * fVar265;
              auVar230._4_4_ = local_5c0._4_4_ * fVar265;
              auVar230._8_4_ = local_5c0._8_4_ * fVar265;
              auVar230._12_4_ = local_5c0._12_4_ * fVar265;
              auVar80 = vfmadd231ps_fma(auVar230,auVar220,local_5e0._0_16_);
              auVar238._0_4_ = fVar265 * (float)local_600._0_4_;
              auVar238._4_4_ = fVar265 * (float)local_600._4_4_;
              auVar238._8_4_ = fVar265 * fStack_5f8;
              auVar238._12_4_ = fVar265 * fStack_5f4;
              auVar81 = vfmadd231ps_fma(auVar238,auVar220,local_5c0._0_16_);
              auVar248._0_4_ = fVar265 * auVar80._0_4_;
              auVar248._4_4_ = fVar265 * auVar80._4_4_;
              auVar248._8_4_ = fVar265 * auVar80._8_4_;
              auVar248._12_4_ = fVar265 * auVar80._12_4_;
              auVar78 = vfmadd231ps_fma(auVar248,auVar220,auVar78);
              auVar202._0_4_ = fVar265 * auVar81._0_4_;
              auVar202._4_4_ = fVar265 * auVar81._4_4_;
              auVar202._8_4_ = fVar265 * auVar81._8_4_;
              auVar202._12_4_ = fVar265 * auVar81._12_4_;
              auVar80 = vfmadd231ps_fma(auVar202,auVar220,auVar80);
              auVar231._0_4_ = fVar265 * auVar80._0_4_;
              auVar231._4_4_ = fVar265 * auVar80._4_4_;
              auVar231._8_4_ = fVar265 * auVar80._8_4_;
              auVar231._12_4_ = fVar265 * auVar80._12_4_;
              auVar81 = vfmadd231ps_fma(auVar231,auVar78,auVar220);
              auVar78 = vsubps_avx(auVar80,auVar78);
              auVar25._8_4_ = 0x40400000;
              auVar25._0_8_ = 0x4040000040400000;
              auVar25._12_4_ = 0x40400000;
              auVar80 = vmulps_avx512vl(auVar78,auVar25);
              local_6e0._0_16_ = auVar81;
              auVar78 = vsubps_avx(auVar79,auVar81);
              _local_760 = auVar78;
              auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
              fVar268 = auVar78._0_4_;
              local_8e0 = ZEXT416((uint)fVar265);
              if (fVar268 < 0.0) {
                auVar168._0_4_ = sqrtf(fVar268);
                auVar168._4_60_ = extraout_var_01;
                auVar79 = auVar168._0_16_;
              }
              else {
                auVar79 = vsqrtss_avx(auVar78,auVar78);
              }
              local_640 = vdpps_avx(auVar80,auVar80,0x7f);
              fVar241 = local_640._0_4_;
              auVar203._4_12_ = ZEXT812(0) << 0x20;
              auVar203._0_4_ = fVar241;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar203);
              fVar250 = auVar81._0_4_;
              local_650 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar203);
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_640,auVar26);
              auVar81 = vfnmadd213ss_fma(local_650,local_640,ZEXT416(0x40000000));
              uVar71 = auVar79._0_4_;
              if (fVar241 < auVar77._0_4_) {
                fVar251 = sqrtf(fVar241);
                auVar79 = ZEXT416(uVar71);
              }
              else {
                auVar77 = vsqrtss_avx(local_640,local_640);
                fVar251 = auVar77._0_4_;
              }
              fVar241 = fVar250 * 1.5 + fVar241 * -0.5 * fVar250 * fVar250 * fVar250;
              local_a00 = auVar80._0_4_;
              fStack_9fc = auVar80._4_4_;
              fStack_9f8 = auVar80._8_4_;
              fStack_9f4 = auVar80._12_4_;
              auVar154._0_4_ = fVar241 * local_a00;
              auVar154._4_4_ = fVar241 * fStack_9fc;
              auVar154._8_4_ = fVar241 * fStack_9f8;
              auVar154._12_4_ = fVar241 * fStack_9f4;
              auVar77 = vdpps_avx(auVar154,_local_760,0x7f);
              auVar83 = vaddss_avx512f(auVar79,ZEXT416(0x3f800000));
              fVar250 = auVar77._0_4_;
              auVar155._0_4_ = fVar250 * fVar250;
              auVar155._4_4_ = auVar77._4_4_ * auVar77._4_4_;
              auVar155._8_4_ = auVar77._8_4_ * auVar77._8_4_;
              auVar155._12_4_ = auVar77._12_4_ * auVar77._12_4_;
              auVar78 = vsubps_avx(auVar78,auVar155);
              fVar252 = auVar78._0_4_;
              auVar179._4_12_ = ZEXT812(0) << 0x20;
              auVar179._0_4_ = fVar252;
              auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
              auVar82 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
              uVar69 = fVar252 == 0.0;
              uVar67 = fVar252 < 0.0;
              if ((bool)uVar67) {
                local_670 = fVar241;
                fStack_66c = fVar241;
                fStack_668 = fVar241;
                fStack_664 = fVar241;
                local_660 = auVar86;
                fVar269 = sqrtf(fVar252);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar79 = ZEXT416(uVar71);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar86 = local_660;
                fVar241 = local_670;
                fVar260 = fStack_66c;
                fVar253 = fStack_668;
                fVar254 = fStack_664;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                fVar269 = auVar78._0_4_;
                fVar260 = fVar241;
                fVar253 = fVar241;
                fVar254 = fVar241;
              }
              auVar262._8_4_ = 0x7fffffff;
              auVar262._0_8_ = 0x7fffffff7fffffff;
              auVar262._12_4_ = 0x7fffffff;
              auVar275 = ZEXT3264(local_700);
              auVar274 = ZEXT3264(auVar97);
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8e0,local_560._0_16_);
              fVar255 = auVar78._0_4_ * 6.0;
              fVar270 = fVar265 * 6.0;
              auVar204._0_4_ = fVar270 * (float)local_600._0_4_;
              auVar204._4_4_ = fVar270 * (float)local_600._4_4_;
              auVar204._8_4_ = fVar270 * fStack_5f8;
              auVar204._12_4_ = fVar270 * fStack_5f4;
              auVar180._4_4_ = fVar255;
              auVar180._0_4_ = fVar255;
              auVar180._8_4_ = fVar255;
              auVar180._12_4_ = fVar255;
              auVar78 = vfmadd132ps_fma(auVar180,auVar204,local_5c0._0_16_);
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_560._0_16_,local_8e0);
              fVar255 = auVar84._0_4_ * 6.0;
              auVar205._4_4_ = fVar255;
              auVar205._0_4_ = fVar255;
              auVar205._8_4_ = fVar255;
              auVar205._12_4_ = fVar255;
              auVar78 = vfmadd132ps_fma(auVar205,auVar78,local_5e0._0_16_);
              fVar255 = local_560._0_4_ * 6.0;
              auVar181._4_4_ = fVar255;
              auVar181._0_4_ = fVar255;
              auVar181._8_4_ = fVar255;
              auVar181._12_4_ = fVar255;
              auVar78 = vfmadd132ps_fma(auVar181,auVar78,local_5a0._0_16_);
              auVar206._0_4_ = auVar78._0_4_ * (float)local_640._0_4_;
              auVar206._4_4_ = auVar78._4_4_ * (float)local_640._0_4_;
              auVar206._8_4_ = auVar78._8_4_ * (float)local_640._0_4_;
              auVar206._12_4_ = auVar78._12_4_ * (float)local_640._0_4_;
              auVar78 = vdpps_avx(auVar80,auVar78,0x7f);
              fVar255 = auVar78._0_4_;
              auVar182._0_4_ = local_a00 * fVar255;
              auVar182._4_4_ = fStack_9fc * fVar255;
              auVar182._8_4_ = fStack_9f8 * fVar255;
              auVar182._12_4_ = fStack_9f4 * fVar255;
              auVar78 = vsubps_avx(auVar206,auVar182);
              fVar255 = auVar81._0_4_ * (float)local_650._0_4_;
              auVar84 = vmaxss_avx(ZEXT416((uint)fVar263),
                                   ZEXT416((uint)(fVar266 * fVar267 * 1.9073486e-06)));
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar87 = vxorps_avx512vl(auVar80,auVar27);
              auVar207._0_4_ = fVar241 * auVar78._0_4_ * fVar255;
              auVar207._4_4_ = fVar260 * auVar78._4_4_ * fVar255;
              auVar207._8_4_ = fVar253 * auVar78._8_4_ * fVar255;
              auVar207._12_4_ = fVar254 * auVar78._12_4_ * fVar255;
              auVar78 = vdpps_avx(auVar87,auVar154,0x7f);
              auVar81 = vfmadd213ss_fma(auVar79,ZEXT416((uint)fVar263),auVar84);
              auVar79 = vdpps_avx(_local_760,auVar207,0x7f);
              vfmadd213ss_avx512f(auVar83,ZEXT416((uint)(fVar263 / fVar251)),auVar81);
              fVar241 = auVar78._0_4_ + auVar79._0_4_;
              auVar78 = vdpps_avx(local_730,auVar154,0x7f);
              auVar79 = vdpps_avx(_local_760,auVar87,0x7f);
              auVar81 = vmulss_avx512f(auVar86,ZEXT416((uint)(fVar252 * -0.5)));
              auVar86 = vmulss_avx512f(auVar86,auVar86);
              auVar82 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar81._0_4_ * auVar86._0_4_)));
              auVar81 = vdpps_avx(_local_760,local_730,0x7f);
              auVar86 = vfnmadd231ss_fma(auVar79,auVar77,ZEXT416((uint)fVar241));
              auVar83 = vfnmadd231ss_fma(auVar81,auVar77,auVar78);
              auVar79 = vpermilps_avx(local_6e0._0_16_,0xff);
              fVar269 = fVar269 - auVar79._0_4_;
              auVar79 = vshufps_avx(auVar80,auVar80,0xff);
              auVar81 = vfmsub213ss_fma(auVar86,auVar82,auVar79);
              fVar251 = auVar83._0_4_ * auVar82._0_4_;
              auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar81._0_4_)),
                                        ZEXT416((uint)fVar241),ZEXT416((uint)fVar251));
              fVar252 = auVar86._0_4_;
              fVar265 = fVar265 - (fVar250 * (fVar251 / fVar252) -
                                  fVar269 * (auVar78._0_4_ / fVar252));
              fVar266 = fVar266 - (fVar269 * (fVar241 / fVar252) -
                                  fVar250 * (auVar81._0_4_ / fVar252));
              auVar78 = vandps_avx(auVar77,auVar262);
              auVar78 = vucomiss_avx512f(auVar78);
              bVar68 = true;
              fVar241 = (float)local_780._0_4_;
              fVar250 = (float)local_780._4_4_;
              fVar251 = fStack_778;
              fVar252 = fStack_774;
              fVar260 = fStack_770;
              fVar253 = fStack_76c;
              fVar254 = fStack_768;
              fVar255 = fStack_764;
              if ((bool)uVar67 || (bool)uVar69) {
LAB_01c04545:
                auVar232 = ZEXT3264(local_720);
              }
              else {
                auVar78 = vaddss_avx512f(auVar84,auVar78);
                auVar81 = vfmadd231ss_fma(auVar78,local_690,ZEXT416(0x36000000));
                auVar78 = vandps_avx(auVar262,ZEXT416((uint)fVar269));
                auVar232 = ZEXT3264(local_720);
                if (auVar81._0_4_ <= auVar78._0_4_) goto LAB_01c04545;
                fVar266 = fVar266 + (float)local_680._0_4_;
                if ((((fVar266 < fVar144) ||
                     (fVar269 = *(float *)(ray + k * 4 + 0x100), fVar269 < fVar266)) ||
                    (fVar265 < 0.0)) || (1.0 < fVar265)) {
LAB_01c04531:
                  bVar68 = false;
                  bVar61 = 0;
                }
                else {
                  auVar47._12_4_ = 0;
                  auVar47._0_12_ = ZEXT812(0);
                  auVar78 = vrsqrt14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)fVar268));
                  fVar270 = auVar78._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar59].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01c04531;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar61 = true;
                  }
                  else {
                    fVar268 = fVar270 * 1.5 + fVar268 * -0.5 * fVar270 * fVar270 * fVar270;
                    auVar183._0_4_ = fVar268 * (float)local_760._0_4_;
                    auVar183._4_4_ = fVar268 * (float)local_760._4_4_;
                    auVar183._8_4_ = fVar268 * fStack_758;
                    auVar183._12_4_ = fVar268 * fStack_754;
                    auVar81 = vfmadd213ps_fma(auVar79,auVar183,auVar80);
                    auVar78 = vshufps_avx(auVar183,auVar183,0xc9);
                    auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                    auVar184._0_4_ = auVar183._0_4_ * auVar79._0_4_;
                    auVar184._4_4_ = auVar183._4_4_ * auVar79._4_4_;
                    auVar184._8_4_ = auVar183._8_4_ * auVar79._8_4_;
                    auVar184._12_4_ = auVar183._12_4_ * auVar79._12_4_;
                    auVar80 = vfmsub231ps_fma(auVar184,auVar80,auVar78);
                    auVar78 = vshufps_avx(auVar80,auVar80,0xc9);
                    auVar79 = vshufps_avx(auVar81,auVar81,0xc9);
                    auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                    auVar156._0_4_ = auVar81._0_4_ * auVar80._0_4_;
                    auVar156._4_4_ = auVar81._4_4_ * auVar80._4_4_;
                    auVar156._8_4_ = auVar81._8_4_ * auVar80._8_4_;
                    auVar156._12_4_ = auVar81._12_4_ * auVar80._12_4_;
                    auVar78 = vfmsub231ps_fma(auVar156,auVar78,auVar79);
                    auVar212._8_4_ = 1;
                    auVar212._0_8_ = 0x100000001;
                    auVar212._12_4_ = 1;
                    auVar212._16_4_ = 1;
                    auVar212._20_4_ = 1;
                    auVar212._24_4_ = 1;
                    auVar212._28_4_ = 1;
                    auVar99 = vpermps_avx2(auVar212,ZEXT1632(auVar78));
                    auVar222._8_4_ = 2;
                    auVar222._0_8_ = 0x200000002;
                    auVar222._12_4_ = 2;
                    auVar222._16_4_ = 2;
                    auVar222._20_4_ = 2;
                    auVar222._24_4_ = 2;
                    auVar222._28_4_ = 2;
                    local_380 = vpermps_avx2(auVar222,ZEXT1632(auVar78));
                    local_360 = auVar78._0_4_;
                    local_3a0[0] = (RTCHitN)auVar99[0];
                    local_3a0[1] = (RTCHitN)auVar99[1];
                    local_3a0[2] = (RTCHitN)auVar99[2];
                    local_3a0[3] = (RTCHitN)auVar99[3];
                    local_3a0[4] = (RTCHitN)auVar99[4];
                    local_3a0[5] = (RTCHitN)auVar99[5];
                    local_3a0[6] = (RTCHitN)auVar99[6];
                    local_3a0[7] = (RTCHitN)auVar99[7];
                    local_3a0[8] = (RTCHitN)auVar99[8];
                    local_3a0[9] = (RTCHitN)auVar99[9];
                    local_3a0[10] = (RTCHitN)auVar99[10];
                    local_3a0[0xb] = (RTCHitN)auVar99[0xb];
                    local_3a0[0xc] = (RTCHitN)auVar99[0xc];
                    local_3a0[0xd] = (RTCHitN)auVar99[0xd];
                    local_3a0[0xe] = (RTCHitN)auVar99[0xe];
                    local_3a0[0xf] = (RTCHitN)auVar99[0xf];
                    local_3a0[0x10] = (RTCHitN)auVar99[0x10];
                    local_3a0[0x11] = (RTCHitN)auVar99[0x11];
                    local_3a0[0x12] = (RTCHitN)auVar99[0x12];
                    local_3a0[0x13] = (RTCHitN)auVar99[0x13];
                    local_3a0[0x14] = (RTCHitN)auVar99[0x14];
                    local_3a0[0x15] = (RTCHitN)auVar99[0x15];
                    local_3a0[0x16] = (RTCHitN)auVar99[0x16];
                    local_3a0[0x17] = (RTCHitN)auVar99[0x17];
                    local_3a0[0x18] = (RTCHitN)auVar99[0x18];
                    local_3a0[0x19] = (RTCHitN)auVar99[0x19];
                    local_3a0[0x1a] = (RTCHitN)auVar99[0x1a];
                    local_3a0[0x1b] = (RTCHitN)auVar99[0x1b];
                    local_3a0[0x1c] = (RTCHitN)auVar99[0x1c];
                    local_3a0[0x1d] = (RTCHitN)auVar99[0x1d];
                    local_3a0[0x1e] = (RTCHitN)auVar99[0x1e];
                    local_3a0[0x1f] = (RTCHitN)auVar99[0x1f];
                    uStack_35c = local_360;
                    uStack_358 = local_360;
                    uStack_354 = local_360;
                    uStack_350 = local_360;
                    uStack_34c = local_360;
                    uStack_348 = local_360;
                    uStack_344 = local_360;
                    local_340 = fVar265;
                    fStack_33c = fVar265;
                    fStack_338 = fVar265;
                    fStack_334 = fVar265;
                    fStack_330 = fVar265;
                    fStack_32c = fVar265;
                    fStack_328 = fVar265;
                    fStack_324 = fVar265;
                    local_320 = ZEXT432(0) << 0x20;
                    local_300 = local_400._0_8_;
                    uStack_2f8 = local_400._8_8_;
                    uStack_2f0 = local_400._16_8_;
                    uStack_2e8 = local_400._24_8_;
                    local_2e0 = local_420;
                    vpcmpeqd_avx2(local_420,local_420);
                    local_2c0 = context->user->instID[0];
                    uStack_2bc = local_2c0;
                    uStack_2b8 = local_2c0;
                    uStack_2b4 = local_2c0;
                    uStack_2b0 = local_2c0;
                    uStack_2ac = local_2c0;
                    uStack_2a8 = local_2c0;
                    uStack_2a4 = local_2c0;
                    local_2a0 = context->user->instPrimID[0];
                    uStack_29c = local_2a0;
                    uStack_298 = local_2a0;
                    uStack_294 = local_2a0;
                    uStack_290 = local_2a0;
                    uStack_28c = local_2a0;
                    uStack_288 = local_2a0;
                    uStack_284 = local_2a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar266;
                    local_6c0 = local_440._0_8_;
                    uStack_6b8 = local_440._8_8_;
                    uStack_6b0 = local_440._16_8_;
                    uStack_6a8 = local_440._24_8_;
                    local_7b0.valid = (int *)&local_6c0;
                    local_7b0.geometryUserPtr = pGVar3->userPtr;
                    local_7b0.context = context->user;
                    local_7b0.hit = local_3a0;
                    local_7b0.N = 8;
                    local_6e0._0_4_ = fVar269;
                    local_7b0.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar274 = ZEXT1664(auVar276);
                      (*pGVar3->occlusionFilterN)(&local_7b0);
                      auVar232 = ZEXT3264(local_720);
                      auVar275 = ZEXT3264(local_700);
                      fVar269 = (float)local_6e0._0_4_;
                      fVar241 = (float)local_780._0_4_;
                      fVar250 = (float)local_780._4_4_;
                      fVar251 = fStack_778;
                      fVar252 = fStack_774;
                      fVar260 = fStack_770;
                      fVar253 = fStack_76c;
                      fVar254 = fStack_768;
                      fVar255 = fStack_764;
                    }
                    auVar50._8_8_ = uStack_6b8;
                    auVar50._0_8_ = local_6c0;
                    auVar50._16_8_ = uStack_6b0;
                    auVar50._24_8_ = uStack_6a8;
                    if (auVar50 == (undefined1  [32])0x0) {
                      bVar61 = false;
                    }
                    else {
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar274 = ZEXT1664(auVar274._0_16_);
                        (*p_Var7)(&local_7b0);
                        auVar232 = ZEXT3264(local_720);
                        auVar275 = ZEXT3264(local_700);
                        fVar269 = (float)local_6e0._0_4_;
                        fVar241 = (float)local_780._0_4_;
                        fVar250 = (float)local_780._4_4_;
                        fVar251 = fStack_778;
                        fVar252 = fStack_774;
                        fVar260 = fStack_770;
                        fVar253 = fStack_76c;
                        fVar254 = fStack_768;
                        fVar255 = fStack_764;
                      }
                      auVar51._8_8_ = uStack_6b8;
                      auVar51._0_8_ = local_6c0;
                      auVar51._16_8_ = uStack_6b0;
                      auVar51._24_8_ = uStack_6a8;
                      uVar70 = vptestmd_avx512vl(auVar51,auVar51);
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar68 = (bool)((byte)uVar70 & 1);
                      bVar8 = (bool)((byte)(uVar70 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar70 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar70 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar70 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar70 >> 6) & 1);
                      bVar14 = SUB81(uVar70 >> 7,0);
                      *(uint *)(local_7b0.ray + 0x100) =
                           (uint)bVar68 * auVar99._0_4_ |
                           (uint)!bVar68 * *(int *)(local_7b0.ray + 0x100);
                      *(uint *)(local_7b0.ray + 0x104) =
                           (uint)bVar8 * auVar99._4_4_ |
                           (uint)!bVar8 * *(int *)(local_7b0.ray + 0x104);
                      *(uint *)(local_7b0.ray + 0x108) =
                           (uint)bVar9 * auVar99._8_4_ |
                           (uint)!bVar9 * *(int *)(local_7b0.ray + 0x108);
                      *(uint *)(local_7b0.ray + 0x10c) =
                           (uint)bVar10 * auVar99._12_4_ |
                           (uint)!bVar10 * *(int *)(local_7b0.ray + 0x10c);
                      *(uint *)(local_7b0.ray + 0x110) =
                           (uint)bVar11 * auVar99._16_4_ |
                           (uint)!bVar11 * *(int *)(local_7b0.ray + 0x110);
                      *(uint *)(local_7b0.ray + 0x114) =
                           (uint)bVar12 * auVar99._20_4_ |
                           (uint)!bVar12 * *(int *)(local_7b0.ray + 0x114);
                      *(uint *)(local_7b0.ray + 0x118) =
                           (uint)bVar13 * auVar99._24_4_ |
                           (uint)!bVar13 * *(int *)(local_7b0.ray + 0x118);
                      *(uint *)(local_7b0.ray + 0x11c) =
                           (uint)bVar14 * auVar99._28_4_ |
                           (uint)!bVar14 * *(int *)(local_7b0.ray + 0x11c);
                      bVar61 = auVar51 != (undefined1  [32])0x0;
                    }
                    if ((bool)bVar61 == false) {
                      *(float *)(ray + k * 4 + 0x100) = fVar269;
                    }
                  }
                  bVar68 = false;
                }
              }
              if (!bVar68) goto LAB_01c04962;
              lVar66 = lVar66 + -1;
            } while (lVar66 != 0);
            bVar61 = 0;
LAB_01c04962:
            bVar63 = bVar63 | bVar61 & 1;
            auVar53._4_4_ = fStack_4bc;
            auVar53._0_4_ = local_4c0;
            auVar53._8_4_ = fStack_4b8;
            auVar53._12_4_ = fStack_4b4;
            auVar53._16_4_ = fStack_4b0;
            auVar53._20_4_ = fStack_4ac;
            auVar53._24_4_ = fStack_4a8;
            auVar53._28_4_ = fStack_4a4;
            uVar240 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar35._4_4_ = uVar240;
            auVar35._0_4_ = uVar240;
            auVar35._8_4_ = uVar240;
            auVar35._12_4_ = uVar240;
            auVar35._16_4_ = uVar240;
            auVar35._20_4_ = uVar240;
            auVar35._24_4_ = uVar240;
            auVar35._28_4_ = uVar240;
            uVar15 = vcmpps_avx512vl(auVar53,auVar35,2);
            bVar62 = bVar64 & bVar62 & (byte)uVar15;
          } while (bVar62 != 0);
        }
        uVar16 = vpcmpd_avx512vl(local_3e0,_local_4e0,1);
        uVar17 = vpcmpd_avx512vl(local_3e0,local_240,1);
        auVar187._0_4_ = fVar241 + (float)local_1c0._0_4_;
        auVar187._4_4_ = fVar250 + (float)local_1c0._4_4_;
        auVar187._8_4_ = fVar251 + fStack_1b8;
        auVar187._12_4_ = fVar252 + fStack_1b4;
        auVar187._16_4_ = fVar260 + fStack_1b0;
        auVar187._20_4_ = fVar253 + fStack_1ac;
        auVar187._24_4_ = fVar254 + fStack_1a8;
        auVar187._28_4_ = fVar255 + fStack_1a4;
        uVar240 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar213._4_4_ = uVar240;
        auVar213._0_4_ = uVar240;
        auVar213._8_4_ = uVar240;
        auVar213._12_4_ = uVar240;
        auVar213._16_4_ = uVar240;
        auVar213._20_4_ = uVar240;
        auVar213._24_4_ = uVar240;
        auVar213._28_4_ = uVar240;
        uVar15 = vcmpps_avx512vl(auVar187,auVar213,2);
        bVar56 = bVar56 & (byte)uVar17 & (byte)uVar15;
        auVar223._0_4_ = fVar241 + (float)local_280._0_4_;
        auVar223._4_4_ = fVar250 + (float)local_280._4_4_;
        auVar223._8_4_ = fVar251 + fStack_278;
        auVar223._12_4_ = fVar252 + fStack_274;
        auVar223._16_4_ = fVar260 + fStack_270;
        auVar223._20_4_ = fVar253 + fStack_26c;
        auVar223._24_4_ = fVar254 + fStack_268;
        auVar223._28_4_ = fVar255 + fStack_264;
        uVar15 = vcmpps_avx512vl(auVar223,auVar213,2);
        bVar58 = bVar58 & (byte)uVar16 & (byte)uVar15 | bVar56;
        if (bVar58 == 0) {
          auVar224 = ZEXT3264(_DAT_02020f20);
          auVar214 = ZEXT3264(local_620);
        }
        else {
          abStack_180[uVar57 * 0x60] = bVar58;
          bVar68 = (bool)(bVar56 >> 1 & 1);
          bVar8 = (bool)(bVar56 >> 2 & 1);
          bVar9 = (bool)(bVar56 >> 3 & 1);
          bVar10 = (bool)(bVar56 >> 4 & 1);
          bVar11 = (bool)(bVar56 >> 5 & 1);
          auStack_160[uVar57 * 0x18] =
               (uint)(bVar56 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar56 & 1) * local_280._0_4_;
          auStack_160[uVar57 * 0x18 + 1] =
               (uint)bVar68 * local_1c0._4_4_ | (uint)!bVar68 * local_280._4_4_;
          auStack_160[uVar57 * 0x18 + 2] =
               (uint)bVar8 * (int)fStack_1b8 | (uint)!bVar8 * (int)fStack_278;
          auStack_160[uVar57 * 0x18 + 3] =
               (uint)bVar9 * (int)fStack_1b4 | (uint)!bVar9 * (int)fStack_274;
          auStack_160[uVar57 * 0x18 + 4] =
               (uint)bVar10 * (int)fStack_1b0 | (uint)!bVar10 * (int)fStack_270;
          auStack_160[uVar57 * 0x18 + 5] =
               (uint)bVar11 * (int)fStack_1ac | (uint)!bVar11 * (int)fStack_26c;
          auStack_160[uVar57 * 0x18 + 6] =
               (uint)(bVar56 >> 6) * (int)fStack_1a8 | (uint)!(bool)(bVar56 >> 6) * (int)fStack_268;
          (&fStack_144)[uVar57 * 0x18] = fStack_264;
          uVar15 = vmovlps_avx(local_6a0);
          (&uStack_140)[uVar57 * 0xc] = uVar15;
          afStack_138[uVar57 * 0x18] = (float)((int)fVar169 + 1);
          auVar224 = ZEXT3264(_DAT_02020f20);
          auVar214 = ZEXT3264(local_620);
          uVar57 = (ulong)((int)uVar57 + 1);
        }
      }
    }
    do {
      if ((int)uVar57 == 0) {
        if (bVar63 != 0) {
          return local_a5d;
        }
        uVar240 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar28._4_4_ = uVar240;
        auVar28._0_4_ = uVar240;
        auVar28._8_4_ = uVar240;
        auVar28._12_4_ = uVar240;
        uVar15 = vcmpps_avx512vl(local_450,auVar28,2);
        uVar59 = (uint)uVar15 & (uint)local_628 - 1 & (uint)local_628;
        local_628 = (ulong)uVar59;
        local_a5d = uVar59 != 0;
        if (!local_a5d) {
          return local_a5d;
        }
        goto LAB_01c023f8;
      }
      uVar60 = (ulong)((int)uVar57 - 1);
      auVar99 = *(undefined1 (*) [32])(auStack_160 + uVar60 * 0x18);
      auVar188._0_4_ = fVar241 + auVar99._0_4_;
      auVar188._4_4_ = fVar250 + auVar99._4_4_;
      auVar188._8_4_ = fVar251 + auVar99._8_4_;
      auVar188._12_4_ = fVar252 + auVar99._12_4_;
      auVar188._16_4_ = fVar260 + auVar99._16_4_;
      auVar188._20_4_ = fVar253 + auVar99._20_4_;
      auVar188._24_4_ = fVar254 + auVar99._24_4_;
      auVar188._28_4_ = fVar255 + auVar99._28_4_;
      uVar240 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar36._4_4_ = uVar240;
      auVar36._0_4_ = uVar240;
      auVar36._8_4_ = uVar240;
      auVar36._12_4_ = uVar240;
      auVar36._16_4_ = uVar240;
      auVar36._20_4_ = uVar240;
      auVar36._24_4_ = uVar240;
      auVar36._28_4_ = uVar240;
      uVar15 = vcmpps_avx512vl(auVar188,auVar36,2);
      uVar71 = (uint)uVar15 & (uint)abStack_180[uVar60 * 0x60];
      bVar58 = (byte)uVar71;
      uVar70 = uVar60;
      if (uVar71 != 0) {
        auVar189._8_4_ = 0x7f800000;
        auVar189._0_8_ = 0x7f8000007f800000;
        auVar189._12_4_ = 0x7f800000;
        auVar189._16_4_ = 0x7f800000;
        auVar189._20_4_ = 0x7f800000;
        auVar189._24_4_ = 0x7f800000;
        auVar189._28_4_ = 0x7f800000;
        auVar100 = vblendmps_avx512vl(auVar189,auVar99);
        auVar136._0_4_ =
             (uint)(bVar58 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)auVar99._0_4_;
        bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar68 * auVar100._4_4_ | (uint)!bVar68 * (int)auVar99._4_4_;
        bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar68 * auVar100._8_4_ | (uint)!bVar68 * (int)auVar99._8_4_;
        bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar68 * auVar100._12_4_ | (uint)!bVar68 * (int)auVar99._12_4_;
        bVar68 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar136._16_4_ = (uint)bVar68 * auVar100._16_4_ | (uint)!bVar68 * (int)auVar99._16_4_;
        bVar68 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar136._20_4_ = (uint)bVar68 * auVar100._20_4_ | (uint)!bVar68 * (int)auVar99._20_4_;
        bVar68 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar136._24_4_ = (uint)bVar68 * auVar100._24_4_ | (uint)!bVar68 * (int)auVar99._24_4_;
        auVar136._28_4_ =
             (uVar71 >> 7) * auVar100._28_4_ | (uint)!SUB41(uVar71 >> 7,0) * (int)auVar99._28_4_;
        auVar99 = vshufps_avx(auVar136,auVar136,0xb1);
        auVar99 = vminps_avx(auVar136,auVar99);
        auVar100 = vshufpd_avx(auVar99,auVar99,5);
        auVar99 = vminps_avx(auVar99,auVar100);
        auVar100 = vpermpd_avx2(auVar99,0x4e);
        auVar99 = vminps_avx(auVar99,auVar100);
        uVar15 = vcmpps_avx512vl(auVar136,auVar99,0);
        bVar62 = (byte)uVar15 & bVar58;
        if (bVar62 != 0) {
          uVar71 = (uint)bVar62;
        }
        fVar263 = afStack_138[uVar60 * 0x18 + -1];
        uVar137 = 0;
        for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
          uVar137 = uVar137 + 1;
        }
        fVar169 = afStack_138[uVar60 * 0x18];
        bVar62 = ~('\x01' << ((byte)uVar137 & 0x1f)) & bVar58;
        abStack_180[uVar60 * 0x60] = bVar62;
        auVar214 = ZEXT3264(local_620);
        if (bVar62 != 0) {
          uVar70 = uVar57;
        }
        fVar265 = *(float *)(&uStack_140 + uVar60 * 0xc);
        auVar190._4_4_ = fVar265;
        auVar190._0_4_ = fVar265;
        auVar190._8_4_ = fVar265;
        auVar190._12_4_ = fVar265;
        auVar190._16_4_ = fVar265;
        auVar190._20_4_ = fVar265;
        auVar190._24_4_ = fVar265;
        auVar190._28_4_ = fVar265;
        fVar263 = fVar263 - fVar265;
        auVar167._4_4_ = fVar263;
        auVar167._0_4_ = fVar263;
        auVar167._8_4_ = fVar263;
        auVar167._12_4_ = fVar263;
        auVar167._16_4_ = fVar263;
        auVar167._20_4_ = fVar263;
        auVar167._24_4_ = fVar263;
        auVar167._28_4_ = fVar263;
        auVar78 = vfmadd132ps_fma(auVar167,auVar190,auVar224._0_32_);
        auVar99 = ZEXT1632(auVar78);
        local_3a0[0] = (RTCHitN)auVar99[0];
        local_3a0[1] = (RTCHitN)auVar99[1];
        local_3a0[2] = (RTCHitN)auVar99[2];
        local_3a0[3] = (RTCHitN)auVar99[3];
        local_3a0[4] = (RTCHitN)auVar99[4];
        local_3a0[5] = (RTCHitN)auVar99[5];
        local_3a0[6] = (RTCHitN)auVar99[6];
        local_3a0[7] = (RTCHitN)auVar99[7];
        local_3a0[8] = (RTCHitN)auVar99[8];
        local_3a0[9] = (RTCHitN)auVar99[9];
        local_3a0[10] = (RTCHitN)auVar99[10];
        local_3a0[0xb] = (RTCHitN)auVar99[0xb];
        local_3a0[0xc] = (RTCHitN)auVar99[0xc];
        local_3a0[0xd] = (RTCHitN)auVar99[0xd];
        local_3a0[0xe] = (RTCHitN)auVar99[0xe];
        local_3a0[0xf] = (RTCHitN)auVar99[0xf];
        local_3a0[0x10] = (RTCHitN)auVar99[0x10];
        local_3a0[0x11] = (RTCHitN)auVar99[0x11];
        local_3a0[0x12] = (RTCHitN)auVar99[0x12];
        local_3a0[0x13] = (RTCHitN)auVar99[0x13];
        local_3a0[0x14] = (RTCHitN)auVar99[0x14];
        local_3a0[0x15] = (RTCHitN)auVar99[0x15];
        local_3a0[0x16] = (RTCHitN)auVar99[0x16];
        local_3a0[0x17] = (RTCHitN)auVar99[0x17];
        local_3a0[0x18] = (RTCHitN)auVar99[0x18];
        local_3a0[0x19] = (RTCHitN)auVar99[0x19];
        local_3a0[0x1a] = (RTCHitN)auVar99[0x1a];
        local_3a0[0x1b] = (RTCHitN)auVar99[0x1b];
        local_3a0[0x1c] = (RTCHitN)auVar99[0x1c];
        local_3a0[0x1d] = (RTCHitN)auVar99[0x1d];
        local_3a0[0x1e] = (RTCHitN)auVar99[0x1e];
        local_3a0[0x1f] = (RTCHitN)auVar99[0x1f];
        local_6a0._8_8_ = 0;
        local_6a0._0_8_ = *(ulong *)(local_3a0 + (ulong)uVar137 * 4);
      }
      uVar57 = uVar70;
    } while (bVar58 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }